

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  uint uVar63;
  int iVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar70;
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  float fVar75;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined4 uVar76;
  undefined1 auVar94 [16];
  undefined1 auVar98 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar159;
  float fVar160;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar161;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar196;
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar197;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined8 uVar198;
  float fVar221;
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar212 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar220;
  float fVar222;
  undefined1 auVar219 [32];
  float fVar226;
  float fVar245;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  float fVar246;
  float fVar268;
  float fVar270;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar272;
  undefined1 auVar251 [16];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar254 [16];
  undefined1 auVar267 [32];
  float fVar274;
  float fVar284;
  __m128 a;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  float fVar296;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar297;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar326 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar335;
  float fVar344;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float local_6c0;
  float fStack_6bc;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_590;
  float fStack_58c;
  float fStack_588;
  RTCFilterFunctionNArguments local_560;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  uint auStack_4d0 [4];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar69;
  undefined1 auVar121 [64];
  undefined1 auVar156 [32];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  lVar70 = uVar68 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar75 = *(float *)(prim + lVar70 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar77._0_4_ = fVar75 * auVar15._0_4_;
  auVar77._4_4_ = fVar75 * auVar15._4_4_;
  auVar77._8_4_ = fVar75 * auVar15._8_4_;
  auVar77._12_4_ = fVar75 * auVar15._12_4_;
  auVar122._0_4_ = fVar75 * auVar16._0_4_;
  auVar122._4_4_ = fVar75 * auVar16._4_4_;
  auVar122._8_4_ = fVar75 * auVar16._8_4_;
  auVar122._12_4_ = fVar75 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar68 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar336._4_4_ = auVar122._0_4_;
  auVar336._0_4_ = auVar122._0_4_;
  auVar336._8_4_ = auVar122._0_4_;
  auVar336._12_4_ = auVar122._0_4_;
  auVar22 = vshufps_avx(auVar122,auVar122,0x55);
  auVar125 = vshufps_avx(auVar122,auVar122,0xaa);
  fVar75 = auVar125._0_4_;
  auVar285._0_4_ = fVar75 * auVar17._0_4_;
  fVar180 = auVar125._4_4_;
  auVar285._4_4_ = fVar180 * auVar17._4_4_;
  fVar196 = auVar125._8_4_;
  auVar285._8_4_ = fVar196 * auVar17._8_4_;
  fVar139 = auVar125._12_4_;
  auVar285._12_4_ = fVar139 * auVar17._12_4_;
  auVar275._0_4_ = auVar186._0_4_ * fVar75;
  auVar275._4_4_ = auVar186._4_4_ * fVar180;
  auVar275._8_4_ = auVar186._8_4_ * fVar196;
  auVar275._12_4_ = auVar186._12_4_ * fVar139;
  auVar247._0_4_ = auVar107._0_4_ * fVar75;
  auVar247._4_4_ = auVar107._4_4_ * fVar180;
  auVar247._8_4_ = auVar107._8_4_ * fVar196;
  auVar247._12_4_ = auVar107._12_4_ * fVar139;
  auVar125 = vfmadd231ps_fma(auVar285,auVar22,auVar16);
  auVar142 = vfmadd231ps_fma(auVar275,auVar22,auVar19);
  auVar22 = vfmadd231ps_fma(auVar247,auVar21,auVar22);
  auVar79 = vfmadd231ps_fma(auVar125,auVar336,auVar15);
  auVar142 = vfmadd231ps_fma(auVar142,auVar336,auVar18);
  auVar80 = vfmadd231ps_fma(auVar22,auVar20,auVar336);
  auVar337._4_4_ = auVar77._0_4_;
  auVar337._0_4_ = auVar77._0_4_;
  auVar337._8_4_ = auVar77._0_4_;
  auVar337._12_4_ = auVar77._0_4_;
  auVar22 = vshufps_avx(auVar77,auVar77,0x55);
  auVar125 = vshufps_avx(auVar77,auVar77,0xaa);
  fVar75 = auVar125._0_4_;
  auVar257._0_4_ = fVar75 * auVar17._0_4_;
  fVar180 = auVar125._4_4_;
  auVar257._4_4_ = fVar180 * auVar17._4_4_;
  fVar196 = auVar125._8_4_;
  auVar257._8_4_ = fVar196 * auVar17._8_4_;
  fVar139 = auVar125._12_4_;
  auVar257._12_4_ = fVar139 * auVar17._12_4_;
  auVar99._0_4_ = auVar186._0_4_ * fVar75;
  auVar99._4_4_ = auVar186._4_4_ * fVar180;
  auVar99._8_4_ = auVar186._8_4_ * fVar196;
  auVar99._12_4_ = auVar186._12_4_ * fVar139;
  auVar78._0_4_ = auVar107._0_4_ * fVar75;
  auVar78._4_4_ = auVar107._4_4_ * fVar180;
  auVar78._8_4_ = auVar107._8_4_ * fVar196;
  auVar78._12_4_ = auVar107._12_4_ * fVar139;
  auVar16 = vfmadd231ps_fma(auVar257,auVar22,auVar16);
  auVar17 = vfmadd231ps_fma(auVar99,auVar22,auVar19);
  auVar19 = vfmadd231ps_fma(auVar78,auVar22,auVar21);
  auVar99 = vfmadd231ps_fma(auVar16,auVar337,auVar15);
  auVar100 = vfmadd231ps_fma(auVar17,auVar337,auVar18);
  auVar345._8_4_ = 0x7fffffff;
  auVar345._0_8_ = 0x7fffffff7fffffff;
  auVar345._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar79,auVar345);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar227,1);
  auVar16 = vblendvps_avx(auVar79,auVar227,auVar15);
  auVar15 = vandps_avx(auVar142,auVar345);
  auVar15 = vcmpps_avx(auVar15,auVar227,1);
  auVar17 = vblendvps_avx(auVar142,auVar227,auVar15);
  auVar15 = vandps_avx(auVar80,auVar345);
  auVar15 = vcmpps_avx(auVar15,auVar227,1);
  auVar15 = vblendvps_avx(auVar80,auVar227,auVar15);
  auVar101 = vfmadd231ps_fma(auVar19,auVar337,auVar20);
  auVar18 = vrcpps_avx(auVar16);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = &DAT_3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar228);
  auVar79 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar16,auVar228);
  auVar80 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar228);
  auVar77 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  fVar75 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar70 + 0x16)) *
           *(float *)(prim + lVar70 + 0x1a);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar191._4_4_ = fVar75;
  auVar191._0_4_ = fVar75;
  auVar191._8_4_ = fVar75;
  auVar191._12_4_ = fVar75;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar78 = vfmadd213ps_fma(auVar16,auVar191,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar17 = vfmadd213ps_fma(auVar16,auVar191,auVar15);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  uVar73 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar73 + 6);
  auVar16 = vpmovsxwd_avx(auVar186);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar18 = vfmadd213ps_fma(auVar16,auVar191,auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar19 = vfmadd213ps_fma(auVar16,auVar191,auVar15);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar15 = vpmovsxwd_avx(auVar107);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar22);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar186 = vfmadd213ps_fma(auVar16,auVar191,auVar15);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar68) + 6);
  auVar15 = vpmovsxwd_avx(auVar125);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar142);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar16 = vfmadd213ps_fma(auVar16,auVar191,auVar15);
  auVar15 = vsubps_avx(auVar78,auVar99);
  auVar199._0_4_ = auVar79._0_4_ * auVar15._0_4_;
  auVar199._4_4_ = auVar79._4_4_ * auVar15._4_4_;
  auVar199._8_4_ = auVar79._8_4_ * auVar15._8_4_;
  auVar199._12_4_ = auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar99);
  auVar123._0_4_ = auVar79._0_4_ * auVar15._0_4_;
  auVar123._4_4_ = auVar79._4_4_ * auVar15._4_4_;
  auVar123._8_4_ = auVar79._8_4_ * auVar15._8_4_;
  auVar123._12_4_ = auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar18,auVar100);
  auVar171._0_4_ = auVar80._0_4_ * auVar15._0_4_;
  auVar171._4_4_ = auVar80._4_4_ * auVar15._4_4_;
  auVar171._8_4_ = auVar80._8_4_ * auVar15._8_4_;
  auVar171._12_4_ = auVar80._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar19,auVar100);
  auVar100._0_4_ = auVar80._0_4_ * auVar15._0_4_;
  auVar100._4_4_ = auVar80._4_4_ * auVar15._4_4_;
  auVar100._8_4_ = auVar80._8_4_ * auVar15._8_4_;
  auVar100._12_4_ = auVar80._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar186,auVar101);
  auVar162._0_4_ = auVar77._0_4_ * auVar15._0_4_;
  auVar162._4_4_ = auVar77._4_4_ * auVar15._4_4_;
  auVar162._8_4_ = auVar77._8_4_ * auVar15._8_4_;
  auVar162._12_4_ = auVar77._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar16,auVar101);
  auVar79._0_4_ = auVar77._0_4_ * auVar15._0_4_;
  auVar79._4_4_ = auVar77._4_4_ * auVar15._4_4_;
  auVar79._8_4_ = auVar77._8_4_ * auVar15._8_4_;
  auVar79._12_4_ = auVar77._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar199,auVar123);
  auVar16 = vpminsd_avx(auVar171,auVar100);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar162,auVar79);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar248._4_4_ = uVar76;
  auVar248._0_4_ = uVar76;
  auVar248._8_4_ = uVar76;
  auVar248._12_4_ = uVar76;
  auVar16 = vmaxps_avx(auVar16,auVar248);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_490._0_4_ = auVar15._0_4_ * 0.99999964;
  local_490._4_4_ = auVar15._4_4_ * 0.99999964;
  local_490._8_4_ = auVar15._8_4_ * 0.99999964;
  local_490._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar199,auVar123);
  auVar16 = vpmaxsd_avx(auVar171,auVar100);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar162,auVar79);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar76;
  auVar124._0_4_ = uVar76;
  auVar124._8_4_ = uVar76;
  auVar124._12_4_ = uVar76;
  auVar16 = vminps_avx(auVar16,auVar124);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar80._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar80._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar80._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar80._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar101._1_3_ = 0;
  auVar101[0] = PVar6;
  auVar101[4] = PVar6;
  auVar101._5_3_ = 0;
  auVar101[8] = PVar6;
  auVar101._9_3_ = 0;
  auVar101[0xc] = PVar6;
  auVar101._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar101,_DAT_01ff0cf0);
  auVar15 = vcmpps_avx(local_490,auVar80,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar63 = vmovmskps_avx(auVar15);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  iVar64 = 1 << ((uint)k & 0x1f);
  auVar97._4_4_ = iVar64;
  auVar97._0_4_ = iVar64;
  auVar97._8_4_ = iVar64;
  auVar97._12_4_ = iVar64;
  auVar97._16_4_ = iVar64;
  auVar97._20_4_ = iVar64;
  auVar97._24_4_ = iVar64;
  auVar97._28_4_ = iVar64;
  auVar24 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar96 = vpand_avx2(auVar97,auVar24);
  local_360 = vpcmpeqd_avx2(auVar96,auVar24);
LAB_017eca0e:
  lVar70 = 0;
  for (uVar68 = (ulong)uVar63; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar67 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar70 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar67].ptr;
  fVar75 = (pGVar8->time_range).lower;
  fVar196 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar75) / ((pGVar8->time_range).upper - fVar75));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar22 = vmaxss_avx(ZEXT816(0),auVar15);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)auVar22._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar74);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar74);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar68);
  lVar70 = uVar68 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar70);
  lVar1 = uVar68 + 2;
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar68 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar61 = *pauVar3;
  fVar75 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar74);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar74);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar68);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar70);
  auVar186 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar180 = *pfVar4;
  fVar139 = pfVar4[1];
  fVar197 = pfVar4[2];
  fVar138 = pfVar4[3];
  auVar323._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar323._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar323._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar323._12_4_ = fVar75 * 0.0;
  auVar309._8_4_ = 0x3f000000;
  auVar309._0_8_ = 0x3f0000003f000000;
  auVar309._12_4_ = 0x3f000000;
  auVar20 = vfmadd231ps_fma(auVar323,auVar17,auVar309);
  auVar20 = vfmadd231ps_fma(auVar20,auVar16,ZEXT816(0) << 0x40);
  auVar123 = vfnmadd231ps_fma(auVar20,auVar15,auVar309);
  auVar200._8_4_ = 0x80000000;
  auVar200._0_8_ = 0x8000000080000000;
  auVar200._12_4_ = 0x80000000;
  auVar249._0_4_ = fVar180 * -0.0;
  auVar249._4_4_ = fVar139 * -0.0;
  auVar249._8_4_ = fVar197 * -0.0;
  auVar249._12_4_ = fVar138 * -0.0;
  auVar20 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar186,auVar249);
  auVar229._0_4_ = auVar19._0_4_ + auVar20._0_4_;
  auVar229._4_4_ = auVar19._4_4_ + auVar20._4_4_;
  auVar229._8_4_ = auVar19._8_4_ + auVar20._8_4_;
  auVar229._12_4_ = auVar19._12_4_ + auVar20._12_4_;
  auVar20 = vfmadd231ps_fma(auVar229,auVar18,auVar200);
  auVar125 = ZEXT816(0) << 0x20;
  auVar201._0_4_ = fVar180 * 0.0;
  auVar201._4_4_ = fVar139 * 0.0;
  auVar201._8_4_ = fVar197 * 0.0;
  auVar201._12_4_ = fVar138 * 0.0;
  auVar21 = vfmadd231ps_fma(auVar201,auVar186,auVar309);
  auVar21 = vfmadd231ps_fma(auVar21,auVar19,auVar125);
  auVar107 = vfnmadd231ps_fma(auVar21,auVar18,auVar309);
  auVar301._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar301._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar301._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar301._12_4_ = fVar75 * 0.5;
  auVar21 = vfmadd231ps_fma(auVar301,auVar125,auVar17);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar309,auVar16);
  auVar79 = vfmadd231ps_fma(auVar21,auVar125,auVar15);
  auVar250._0_4_ = auVar249._0_4_ + auVar186._0_4_;
  auVar250._4_4_ = auVar249._4_4_ + auVar186._4_4_;
  auVar250._8_4_ = auVar249._8_4_ + auVar186._8_4_;
  auVar250._12_4_ = auVar249._12_4_ + auVar186._12_4_;
  auVar21 = vfmadd231ps_fma(auVar250,auVar19,auVar125);
  auVar140._8_4_ = 0x80000000;
  auVar140._0_8_ = 0x8000000080000000;
  auVar140._12_4_ = 0x80000000;
  auVar21 = vfmadd231ps_fma(auVar21,auVar18,auVar140);
  auVar181._0_4_ = fVar180 * 0.5;
  auVar181._4_4_ = fVar139 * 0.5;
  auVar181._8_4_ = fVar197 * 0.5;
  auVar181._12_4_ = fVar138 * 0.5;
  auVar186 = vfmadd231ps_fma(auVar181,auVar125,auVar186);
  auVar19 = vfnmadd231ps_fma(auVar186,auVar309,auVar19);
  auVar186 = vfmadd231ps_fma(auVar19,auVar125,auVar18);
  auVar18 = vshufps_avx(auVar123,auVar123,0xc9);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar224 = auVar123._0_4_;
  auVar102._0_4_ = fVar224 * auVar19._0_4_;
  fVar300 = auVar123._4_4_;
  auVar102._4_4_ = fVar300 * auVar19._4_4_;
  fVar225 = auVar123._8_4_;
  auVar102._8_4_ = fVar225 * auVar19._8_4_;
  fVar226 = auVar123._12_4_;
  auVar102._12_4_ = fVar226 * auVar19._12_4_;
  auVar80 = vfmsub231ps_fma(auVar102,auVar18,auVar20);
  auVar19 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar103._0_4_ = fVar224 * auVar19._0_4_;
  auVar103._4_4_ = fVar300 * auVar19._4_4_;
  auVar103._8_4_ = fVar225 * auVar19._8_4_;
  auVar103._12_4_ = fVar226 * auVar19._12_4_;
  auVar77 = vfmsub231ps_fma(auVar103,auVar18,auVar107);
  auVar18 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar19 = vshufps_avx(auVar21,auVar21,0xc9);
  fVar222 = auVar79._0_4_;
  auVar104._0_4_ = fVar222 * auVar19._0_4_;
  fVar298 = auVar79._4_4_;
  auVar104._4_4_ = fVar298 * auVar19._4_4_;
  fVar223 = auVar79._8_4_;
  auVar104._8_4_ = fVar223 * auVar19._8_4_;
  fVar299 = auVar79._12_4_;
  auVar104._12_4_ = fVar299 * auVar19._12_4_;
  auVar78 = vfmsub231ps_fma(auVar104,auVar18,auVar21);
  auVar19 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar105._0_4_ = fVar222 * auVar19._0_4_;
  auVar105._4_4_ = fVar298 * auVar19._4_4_;
  auVar105._8_4_ = fVar223 * auVar19._8_4_;
  auVar105._12_4_ = fVar299 * auVar19._12_4_;
  auVar99 = vfmsub231ps_fma(auVar105,auVar18,auVar186);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar74);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar74);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar70);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar62 = *pauVar3;
  fVar138 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar74);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar74);
  auVar286._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar286._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar286._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar286._12_4_ = fVar138 * 0.0;
  auVar186 = vfmadd231ps_fma(auVar286,auVar19,auVar309);
  auVar20 = vfmadd231ps_fma(auVar186,auVar18,auVar125);
  auVar186 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar68);
  auVar124 = vfnmadd231ps_fma(auVar20,auVar186,auVar309);
  auVar20 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar180 = *pfVar4;
  fVar139 = pfVar4[1];
  fVar197 = pfVar4[2];
  fVar137 = pfVar4[3];
  auVar230._8_4_ = 0x80000000;
  auVar230._0_8_ = 0x8000000080000000;
  auVar230._12_4_ = 0x80000000;
  auVar141._0_4_ = fVar180 * -0.0;
  auVar141._4_4_ = fVar139 * -0.0;
  auVar141._8_4_ = fVar197 * -0.0;
  auVar141._12_4_ = fVar137 * -0.0;
  auVar107 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar20,auVar141);
  auVar21 = *(undefined1 (*) [16])(lVar13 + lVar70 * lVar10);
  auVar182._0_4_ = auVar21._0_4_ + auVar107._0_4_;
  auVar182._4_4_ = auVar21._4_4_ + auVar107._4_4_;
  auVar182._8_4_ = auVar21._8_4_ + auVar107._8_4_;
  auVar182._12_4_ = auVar21._12_4_ + auVar107._12_4_;
  auVar107 = *(undefined1 (*) [16])(lVar13 + uVar68 * lVar10);
  auVar142 = vfmadd231ps_fma(auVar182,auVar107,auVar230);
  auVar125 = vshufps_avx(auVar142,auVar142,0xc9);
  fVar220 = auVar124._0_4_;
  auVar81._0_4_ = fVar220 * auVar125._0_4_;
  fVar296 = auVar124._4_4_;
  auVar81._4_4_ = fVar296 * auVar125._4_4_;
  fVar221 = auVar124._8_4_;
  auVar81._8_4_ = fVar221 * auVar125._8_4_;
  fVar297 = auVar124._12_4_;
  auVar81._12_4_ = fVar297 * auVar125._12_4_;
  auVar125 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar100 = vfmsub231ps_fma(auVar81,auVar125,auVar142);
  auVar82._0_4_ = fVar180 * 0.0;
  auVar82._4_4_ = fVar139 * 0.0;
  auVar82._8_4_ = fVar197 * 0.0;
  auVar82._12_4_ = fVar137 * 0.0;
  auVar163._8_4_ = 0x3f000000;
  auVar163._0_8_ = 0x3f0000003f000000;
  auVar163._12_4_ = 0x3f000000;
  auVar142 = vfmadd231ps_fma(auVar82,auVar20,auVar163);
  auVar142 = vfmadd231ps_fma(auVar142,auVar21,ZEXT816(0) << 0x20);
  auVar101 = vfnmadd231ps_fma(auVar142,auVar107,auVar163);
  auVar142 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar183._0_4_ = fVar220 * auVar142._0_4_;
  auVar183._4_4_ = fVar296 * auVar142._4_4_;
  auVar183._8_4_ = fVar221 * auVar142._8_4_;
  auVar183._12_4_ = fVar297 * auVar142._12_4_;
  auVar101 = vfmsub231ps_fma(auVar183,auVar125,auVar101);
  auVar83._0_4_ = auVar20._0_4_ + auVar141._0_4_;
  auVar83._4_4_ = auVar20._4_4_ + auVar141._4_4_;
  auVar83._8_4_ = auVar20._8_4_ + auVar141._8_4_;
  auVar83._12_4_ = auVar20._12_4_ + auVar141._12_4_;
  auVar106._0_4_ = fVar180 * 0.5;
  auVar106._4_4_ = fVar139 * 0.5;
  auVar106._8_4_ = fVar197 * 0.5;
  auVar106._12_4_ = fVar137 * 0.5;
  auVar142 = ZEXT416(0) << 0x20;
  auVar20 = vfmadd231ps_fma(auVar106,auVar142,auVar20);
  auVar125 = vfmadd231ps_fma(auVar83,auVar21,auVar142);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar163,auVar21);
  auVar21 = vfmadd231ps_fma(auVar125,auVar107,auVar230);
  auVar107 = vfmadd231ps_fma(auVar20,auVar142,auVar107);
  auVar346._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar346._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar346._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar346._12_4_ = fVar138 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar346,auVar142,auVar19);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar163,auVar18);
  auVar125 = vfmadd231ps_fma(auVar20,auVar142,auVar186);
  auVar52._12_4_ = 0;
  auVar52._0_12_ = ZEXT812(0);
  auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
  fVar245 = auVar125._0_4_;
  auVar143._0_4_ = fVar245 * auVar20._0_4_;
  fVar274 = auVar125._4_4_;
  auVar143._4_4_ = fVar274 * auVar20._4_4_;
  fVar284 = auVar125._8_4_;
  auVar143._8_4_ = fVar284 * auVar20._8_4_;
  fVar335 = auVar125._12_4_;
  auVar143._12_4_ = fVar335 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar122 = vfmsub231ps_fma(auVar143,auVar20,auVar21);
  auVar21 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar84._0_4_ = fVar245 * auVar21._0_4_;
  auVar84._4_4_ = fVar274 * auVar21._4_4_;
  auVar84._8_4_ = fVar284 * auVar21._8_4_;
  auVar84._12_4_ = fVar335 * auVar21._12_4_;
  auVar257 = vfmsub231ps_fma(auVar84,auVar20,auVar107);
  fVar196 = fVar196 - auVar22._0_4_;
  local_700._0_4_ = auVar61._0_4_;
  local_700._4_4_ = auVar61._4_4_;
  fStack_6f8 = auVar61._8_4_;
  auVar85._0_4_ = (float)local_700._0_4_ * -0.0;
  auVar85._4_4_ = (float)local_700._4_4_ * -0.0;
  auVar85._8_4_ = fStack_6f8 * -0.0;
  auVar85._12_4_ = fVar75 * -0.0;
  auVar20 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar17,auVar85);
  auVar164._0_4_ = auVar17._0_4_ + auVar85._0_4_;
  auVar164._4_4_ = auVar17._4_4_ + auVar85._4_4_;
  auVar164._8_4_ = auVar17._8_4_ + auVar85._8_4_;
  auVar164._12_4_ = auVar17._12_4_ + auVar85._12_4_;
  auVar184._0_4_ = auVar16._0_4_ + auVar20._0_4_;
  auVar184._4_4_ = auVar16._4_4_ + auVar20._4_4_;
  auVar184._8_4_ = auVar16._8_4_ + auVar20._8_4_;
  auVar184._12_4_ = auVar16._12_4_ + auVar20._12_4_;
  auVar21 = vpermilps_avx(auVar80,0xc9);
  auVar17 = vdpps_avx(auVar21,auVar21,0x7f);
  auVar16 = vfmadd231ps_fma(auVar164,auVar16,auVar52 << 0x20);
  auVar22 = vfmadd231ps_fma(auVar184,auVar15,auVar230);
  auVar142 = vfmadd231ps_fma(auVar16,auVar15,auVar230);
  fVar180 = auVar17._0_4_;
  auVar107 = ZEXT416((uint)fVar180);
  auVar15 = vrsqrtss_avx(auVar107,auVar107);
  fVar75 = auVar15._0_4_;
  fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar180 * -0.5 * fVar75;
  auVar16 = vpermilps_avx(auVar77,0xc9);
  auVar15 = vdpps_avx(auVar21,auVar16,0x7f);
  auVar231._0_4_ = fVar180 * auVar16._0_4_;
  auVar231._4_4_ = fVar180 * auVar16._4_4_;
  auVar231._8_4_ = fVar180 * auVar16._8_4_;
  auVar231._12_4_ = fVar180 * auVar16._12_4_;
  fVar180 = auVar15._0_4_;
  auVar276._0_4_ = fVar180 * auVar21._0_4_;
  auVar276._4_4_ = fVar180 * auVar21._4_4_;
  auVar276._8_4_ = fVar180 * auVar21._8_4_;
  auVar276._12_4_ = fVar180 * auVar21._12_4_;
  auVar20 = vsubps_avx(auVar231,auVar276);
  auVar15 = vrcpss_avx(auVar107,auVar107);
  auVar16 = vfnmadd213ss_fma(auVar17,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar139 = auVar15._0_4_ * auVar16._0_4_;
  auVar107 = vpermilps_avx(auVar78,0xc9);
  auVar16 = vdpps_avx(auVar107,auVar107,0x7f);
  fVar246 = auVar21._0_4_ * fVar75;
  fVar268 = auVar21._4_4_ * fVar75;
  fVar270 = auVar21._8_4_ * fVar75;
  fVar272 = auVar21._12_4_ * fVar75;
  auVar21 = vpermilps_avx(auVar99,0xc9);
  auVar15 = vblendps_avx(auVar16,_DAT_01feba10,0xe);
  auVar17 = vrsqrtss_avx(auVar15,auVar15);
  fVar197 = auVar16._0_4_;
  fVar180 = auVar17._0_4_;
  auVar17 = vdpps_avx(auVar107,auVar21,0x7f);
  fVar180 = fVar180 * 1.5 + fVar180 * fVar197 * -0.5 * fVar180 * fVar180;
  auVar108._0_4_ = fVar197 * auVar21._0_4_;
  auVar108._4_4_ = fVar197 * auVar21._4_4_;
  auVar108._8_4_ = fVar197 * auVar21._8_4_;
  auVar108._12_4_ = fVar197 * auVar21._12_4_;
  fVar197 = auVar17._0_4_;
  auVar126._0_4_ = fVar197 * auVar107._0_4_;
  auVar126._4_4_ = fVar197 * auVar107._4_4_;
  auVar126._8_4_ = fVar197 * auVar107._8_4_;
  auVar126._12_4_ = fVar197 * auVar107._12_4_;
  auVar17 = vsubps_avx(auVar108,auVar126);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,ZEXT416(0x40000000));
  fVar197 = auVar15._0_4_ * auVar16._0_4_;
  fVar137 = auVar107._0_4_ * fVar180;
  fVar159 = auVar107._4_4_ * fVar180;
  fVar160 = auVar107._8_4_ * fVar180;
  fVar161 = auVar107._12_4_ * fVar180;
  auVar15 = vshufps_avx(auVar123,auVar123,0xff);
  auVar16 = vshufps_avx(auVar22,auVar22,0xff);
  auVar202._0_4_ = fVar246 * auVar16._0_4_;
  auVar202._4_4_ = fVar268 * auVar16._4_4_;
  auVar202._8_4_ = fVar270 * auVar16._8_4_;
  auVar202._12_4_ = fVar272 * auVar16._12_4_;
  auVar109._0_4_ = fVar246 * auVar15._0_4_ + fVar75 * fVar139 * auVar20._0_4_ * auVar16._0_4_;
  auVar109._4_4_ = fVar268 * auVar15._4_4_ + fVar75 * fVar139 * auVar20._4_4_ * auVar16._4_4_;
  auVar109._8_4_ = fVar270 * auVar15._8_4_ + fVar75 * fVar139 * auVar20._8_4_ * auVar16._8_4_;
  auVar109._12_4_ = fVar272 * auVar15._12_4_ + fVar75 * fVar139 * auVar20._12_4_ * auVar16._12_4_;
  auVar20 = vsubps_avx(auVar22,auVar202);
  fVar246 = auVar22._0_4_ + auVar202._0_4_;
  fVar268 = auVar22._4_4_ + auVar202._4_4_;
  fVar270 = auVar22._8_4_ + auVar202._8_4_;
  fVar272 = auVar22._12_4_ + auVar202._12_4_;
  auVar21 = vsubps_avx(auVar123,auVar109);
  auVar15 = vshufps_avx(auVar79,auVar79,0xff);
  auVar16 = vshufps_avx(auVar142,auVar142,0xff);
  auVar144._0_4_ = auVar16._0_4_ * fVar137;
  auVar144._4_4_ = auVar16._4_4_ * fVar159;
  auVar144._8_4_ = auVar16._8_4_ * fVar160;
  auVar144._12_4_ = auVar16._12_4_ * fVar161;
  auVar185._0_4_ = auVar15._0_4_ * fVar137 + auVar16._0_4_ * fVar180 * auVar17._0_4_ * fVar197;
  auVar185._4_4_ = auVar15._4_4_ * fVar159 + auVar16._4_4_ * fVar180 * auVar17._4_4_ * fVar197;
  auVar185._8_4_ = auVar15._8_4_ * fVar160 + auVar16._8_4_ * fVar180 * auVar17._8_4_ * fVar197;
  auVar185._12_4_ = auVar15._12_4_ * fVar161 + auVar16._12_4_ * fVar180 * auVar17._12_4_ * fVar197;
  auVar17 = vsubps_avx(auVar142,auVar144);
  local_700._4_4_ = auVar142._4_4_ + auVar144._4_4_;
  local_700._0_4_ = auVar142._0_4_ + auVar144._0_4_;
  fStack_6f8 = auVar142._8_4_ + auVar144._8_4_;
  fStack_6f4 = auVar142._12_4_ + auVar144._12_4_;
  auVar107 = vsubps_avx(auVar79,auVar185);
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  local_590 = auVar62._0_4_;
  fStack_58c = auVar62._4_4_;
  fStack_588 = auVar62._8_4_;
  auVar145._0_4_ = local_590 * -0.0;
  auVar145._4_4_ = fStack_58c * -0.0;
  auVar145._8_4_ = fStack_588 * -0.0;
  auVar145._12_4_ = fVar138 * -0.0;
  auVar15 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar19,auVar145);
  auVar232._0_4_ = auVar19._0_4_ + auVar145._0_4_;
  auVar232._4_4_ = auVar19._4_4_ + auVar145._4_4_;
  auVar232._8_4_ = auVar19._8_4_ + auVar145._8_4_;
  auVar232._12_4_ = auVar19._12_4_ + auVar145._12_4_;
  auVar338._0_4_ = auVar18._0_4_ + auVar15._0_4_;
  auVar338._4_4_ = auVar18._4_4_ + auVar15._4_4_;
  auVar338._8_4_ = auVar18._8_4_ + auVar15._8_4_;
  auVar338._12_4_ = auVar18._12_4_ + auVar15._12_4_;
  auVar16 = vfmadd231ps_fma(auVar232,auVar18,ZEXT816(0) << 0x20);
  auVar22 = vfmadd231ps_fma(auVar338,auVar186,auVar86);
  auVar19 = vpermilps_avx(auVar100,0xc9);
  auVar15 = vdpps_avx(auVar19,auVar19,0x7f);
  auVar142 = vfmadd231ps_fma(auVar16,auVar186,auVar86);
  fVar180 = auVar15._0_4_;
  auVar186 = ZEXT416((uint)fVar180);
  auVar16 = vrsqrtss_avx(auVar186,auVar186);
  fVar75 = auVar16._0_4_;
  fVar75 = fVar180 * -0.5 * fVar75 * fVar75 * fVar75 + fVar75 * 1.5;
  auVar16 = vpermilps_avx(auVar101,0xc9);
  auVar277._0_4_ = fVar180 * auVar16._0_4_;
  auVar277._4_4_ = fVar180 * auVar16._4_4_;
  auVar277._8_4_ = fVar180 * auVar16._8_4_;
  auVar277._12_4_ = fVar180 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar19,auVar16,0x7f);
  fVar180 = auVar16._0_4_;
  auVar251._0_4_ = fVar180 * auVar19._0_4_;
  auVar251._4_4_ = fVar180 * auVar19._4_4_;
  auVar251._8_4_ = fVar180 * auVar19._8_4_;
  auVar251._12_4_ = fVar180 * auVar19._12_4_;
  auVar18 = vsubps_avx(auVar277,auVar251);
  auVar16 = vrcpss_avx(auVar186,auVar186);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar139 = auVar16._0_4_ * auVar15._0_4_;
  fVar138 = auVar19._0_4_ * fVar75;
  fVar137 = auVar19._4_4_ * fVar75;
  fVar159 = auVar19._8_4_ * fVar75;
  fVar160 = auVar19._12_4_ * fVar75;
  auVar186 = vpermilps_avx(auVar122,0xc9);
  auVar15 = vdpps_avx(auVar186,auVar186,0x7f);
  fVar197 = auVar15._0_4_;
  auVar79 = ZEXT416((uint)fVar197);
  auVar16 = vrsqrtss_avx(auVar79,auVar79);
  fVar180 = auVar16._0_4_;
  auVar19 = vpermilps_avx(auVar257,0xc9);
  auVar16 = vdpps_avx(auVar186,auVar19,0x7f);
  fVar180 = fVar180 * 1.5 + fVar197 * -0.5 * fVar180 * fVar180 * fVar180;
  auVar310._0_4_ = fVar197 * auVar19._0_4_;
  auVar310._4_4_ = fVar197 * auVar19._4_4_;
  auVar310._8_4_ = fVar197 * auVar19._8_4_;
  auVar310._12_4_ = fVar197 * auVar19._12_4_;
  fVar197 = auVar16._0_4_;
  auVar87._0_4_ = fVar197 * auVar186._0_4_;
  auVar87._4_4_ = fVar197 * auVar186._4_4_;
  auVar87._8_4_ = fVar197 * auVar186._8_4_;
  auVar87._12_4_ = fVar197 * auVar186._12_4_;
  auVar19 = vsubps_avx(auVar310,auVar87);
  auVar16 = vrcpss_avx(auVar79,auVar79);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar197 = auVar16._0_4_ * auVar15._0_4_;
  fVar161 = auVar186._0_4_ * fVar180;
  fVar269 = auVar186._4_4_ * fVar180;
  fVar271 = auVar186._8_4_ * fVar180;
  fVar273 = auVar186._12_4_ * fVar180;
  auVar15 = vshufps_avx(auVar124,auVar124,0xff);
  auVar16 = vshufps_avx(auVar22,auVar22,0xff);
  auVar146._0_4_ = auVar16._0_4_ * fVar138;
  auVar146._4_4_ = auVar16._4_4_ * fVar137;
  auVar146._8_4_ = auVar16._8_4_ * fVar159;
  auVar146._12_4_ = auVar16._12_4_ * fVar160;
  auVar165._0_4_ = auVar15._0_4_ * fVar138 + auVar16._0_4_ * fVar75 * auVar18._0_4_ * fVar139;
  auVar165._4_4_ = auVar15._4_4_ * fVar137 + auVar16._4_4_ * fVar75 * auVar18._4_4_ * fVar139;
  auVar165._8_4_ = auVar15._8_4_ * fVar159 + auVar16._8_4_ * fVar75 * auVar18._8_4_ * fVar139;
  auVar165._12_4_ = auVar15._12_4_ * fVar160 + auVar16._12_4_ * fVar75 * auVar18._12_4_ * fVar139;
  auVar18 = vsubps_avx(auVar22,auVar146);
  fVar139 = auVar22._0_4_ + auVar146._0_4_;
  fVar138 = auVar22._4_4_ + auVar146._4_4_;
  fVar137 = auVar22._8_4_ + auVar146._8_4_;
  fVar159 = auVar22._12_4_ + auVar146._12_4_;
  auVar186 = vsubps_avx(auVar124,auVar165);
  auVar15 = vshufps_avx(auVar125,auVar125,0xff);
  auVar16 = vshufps_avx(auVar142,auVar142,0xff);
  auVar252._0_4_ = fVar161 * auVar16._0_4_;
  auVar252._4_4_ = fVar269 * auVar16._4_4_;
  auVar252._8_4_ = fVar271 * auVar16._8_4_;
  auVar252._12_4_ = fVar273 * auVar16._12_4_;
  auVar88._0_4_ = fVar161 * auVar15._0_4_ + auVar16._0_4_ * fVar180 * auVar19._0_4_ * fVar197;
  auVar88._4_4_ = fVar269 * auVar15._4_4_ + auVar16._4_4_ * fVar180 * auVar19._4_4_ * fVar197;
  auVar88._8_4_ = fVar271 * auVar15._8_4_ + auVar16._8_4_ * fVar180 * auVar19._8_4_ * fVar197;
  auVar88._12_4_ = fVar273 * auVar15._12_4_ + auVar16._12_4_ * fVar180 * auVar19._12_4_ * fVar197;
  auVar15 = vsubps_avx(auVar142,auVar252);
  auVar166._0_4_ = auVar252._0_4_ + auVar142._0_4_;
  auVar166._4_4_ = auVar252._4_4_ + auVar142._4_4_;
  auVar166._8_4_ = auVar252._8_4_ + auVar142._8_4_;
  auVar166._12_4_ = auVar252._12_4_ + auVar142._12_4_;
  auVar16 = vsubps_avx(auVar125,auVar88);
  local_760._0_4_ = auVar21._0_4_;
  local_760._4_4_ = auVar21._4_4_;
  fStack_758 = auVar21._8_4_;
  fStack_754 = auVar21._12_4_;
  auVar89._0_4_ = auVar20._0_4_ + (float)local_760._0_4_ * 0.33333334;
  auVar89._4_4_ = auVar20._4_4_ + (float)local_760._4_4_ * 0.33333334;
  auVar89._8_4_ = auVar20._8_4_ + fStack_758 * 0.33333334;
  auVar89._12_4_ = auVar20._12_4_ + fStack_754 * 0.33333334;
  fVar75 = 1.0 - fVar196;
  auVar233._4_4_ = fVar75;
  auVar233._0_4_ = fVar75;
  auVar233._8_4_ = fVar75;
  auVar233._12_4_ = fVar75;
  auVar311._0_4_ = fVar196 * auVar18._0_4_;
  auVar311._4_4_ = fVar196 * auVar18._4_4_;
  auVar311._8_4_ = fVar196 * auVar18._8_4_;
  auVar311._12_4_ = fVar196 * auVar18._12_4_;
  local_510 = vfmadd231ps_fma(auVar311,auVar233,auVar20);
  auVar127._0_4_ = fVar196 * (auVar18._0_4_ + auVar186._0_4_ * 0.33333334);
  auVar127._4_4_ = fVar196 * (auVar18._4_4_ + auVar186._4_4_ * 0.33333334);
  auVar127._8_4_ = fVar196 * (auVar18._8_4_ + auVar186._8_4_ * 0.33333334);
  auVar127._12_4_ = fVar196 * (auVar18._12_4_ + auVar186._12_4_ * 0.33333334);
  auVar20 = vfmadd231ps_fma(auVar127,auVar233,auVar89);
  local_710 = auVar107._0_4_;
  fStack_70c = auVar107._4_4_;
  fStack_708 = auVar107._8_4_;
  fStack_704 = auVar107._12_4_;
  auVar90._0_4_ = local_710 * 0.33333334;
  auVar90._4_4_ = fStack_70c * 0.33333334;
  auVar90._8_4_ = fStack_708 * 0.33333334;
  auVar90._12_4_ = fStack_704 * 0.33333334;
  auVar18 = vsubps_avx(auVar17,auVar90);
  auVar53._4_4_ = fVar268;
  auVar53._0_4_ = fVar246;
  auVar53._8_4_ = fVar270;
  auVar53._12_4_ = fVar272;
  auVar324._0_4_ = fVar246 + (fVar224 + auVar109._0_4_) * 0.33333334;
  auVar324._4_4_ = fVar268 + (fVar300 + auVar109._4_4_) * 0.33333334;
  auVar324._8_4_ = fVar270 + (fVar225 + auVar109._8_4_) * 0.33333334;
  auVar324._12_4_ = fVar272 + (fVar226 + auVar109._12_4_) * 0.33333334;
  auVar302._0_4_ = (fVar222 + auVar185._0_4_) * 0.33333334;
  auVar302._4_4_ = (fVar298 + auVar185._4_4_) * 0.33333334;
  auVar302._8_4_ = (fVar223 + auVar185._8_4_) * 0.33333334;
  auVar302._12_4_ = (fVar299 + auVar185._12_4_) * 0.33333334;
  auVar19 = vsubps_avx(_local_700,auVar302);
  auVar287._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar287._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar287._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar287._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar15,auVar287);
  auVar253._0_4_ = (fVar245 + auVar88._0_4_) * 0.33333334;
  auVar253._4_4_ = (fVar274 + auVar88._4_4_) * 0.33333334;
  auVar253._8_4_ = (fVar284 + auVar88._8_4_) * 0.33333334;
  auVar253._12_4_ = (fVar335 + auVar88._12_4_) * 0.33333334;
  auVar186 = vsubps_avx(auVar166,auVar253);
  auVar288._0_4_ = fVar196 * auVar16._0_4_;
  auVar288._4_4_ = fVar196 * auVar16._4_4_;
  auVar288._8_4_ = fVar196 * auVar16._8_4_;
  auVar288._12_4_ = fVar196 * auVar16._12_4_;
  auVar203._0_4_ = fVar196 * auVar15._0_4_;
  auVar203._4_4_ = fVar196 * auVar15._4_4_;
  auVar203._8_4_ = fVar196 * auVar15._8_4_;
  auVar203._12_4_ = fVar196 * auVar15._12_4_;
  local_520 = vfmadd231ps_fma(auVar288,auVar233,auVar18);
  auVar21 = vfmadd231ps_fma(auVar203,auVar233,auVar17);
  auVar91._0_4_ = fVar196 * fVar139;
  auVar91._4_4_ = fVar196 * fVar138;
  auVar91._8_4_ = fVar196 * fVar137;
  auVar91._12_4_ = fVar196 * fVar159;
  auVar110._0_4_ = fVar196 * (fVar139 + (fVar220 + auVar165._0_4_) * 0.33333334);
  auVar110._4_4_ = fVar196 * (fVar138 + (fVar296 + auVar165._4_4_) * 0.33333334);
  auVar110._8_4_ = fVar196 * (fVar137 + (fVar221 + auVar165._8_4_) * 0.33333334);
  auVar110._12_4_ = fVar196 * (fVar159 + (fVar297 + auVar165._12_4_) * 0.33333334);
  auVar147._0_4_ = fVar196 * auVar186._0_4_;
  auVar147._4_4_ = fVar196 * auVar186._4_4_;
  auVar147._8_4_ = fVar196 * auVar186._8_4_;
  auVar147._12_4_ = fVar196 * auVar186._12_4_;
  auVar167._0_4_ = fVar196 * auVar166._0_4_;
  auVar167._4_4_ = fVar196 * auVar166._4_4_;
  auVar167._8_4_ = fVar196 * auVar166._8_4_;
  auVar167._12_4_ = fVar196 * auVar166._12_4_;
  _local_530 = vfmadd231ps_fma(auVar91,auVar233,auVar53);
  auVar107 = vfmadd231ps_fma(auVar110,auVar233,auVar324);
  auVar22 = vfmadd231ps_fma(auVar147,auVar233,auVar19);
  auVar125 = vfmadd231ps_fma(auVar167,auVar233,_local_700);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_4f0 = vsubps_avx(local_510,auVar15);
  auVar16 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar17 = vshufps_avx(local_4f0,local_4f0,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar75 = pre->ray_space[k].vz.field_0.m128[0];
  fVar180 = pre->ray_space[k].vz.field_0.m128[1];
  fVar196 = pre->ray_space[k].vz.field_0.m128[2];
  fVar139 = pre->ray_space[k].vz.field_0.m128[3];
  auVar92._0_4_ = fVar75 * auVar17._0_4_;
  auVar92._4_4_ = fVar180 * auVar17._4_4_;
  auVar92._8_4_ = fVar196 * auVar17._8_4_;
  auVar92._12_4_ = fVar139 * auVar17._12_4_;
  auVar18 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar16);
  local_500 = vsubps_avx(auVar20,auVar15);
  auVar16 = vshufps_avx(local_500,local_500,0x55);
  auVar17 = vshufps_avx(local_500,local_500,0xaa);
  auVar347._0_4_ = fVar75 * auVar17._0_4_;
  auVar347._4_4_ = fVar180 * auVar17._4_4_;
  auVar347._8_4_ = fVar196 * auVar17._8_4_;
  auVar347._12_4_ = fVar139 * auVar17._12_4_;
  auVar17 = vfmadd231ps_fma(auVar347,(undefined1  [16])aVar5,auVar16);
  local_3e0 = vsubps_avx(local_520,auVar15);
  auVar16 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar339._0_4_ = fVar75 * auVar16._0_4_;
  auVar339._4_4_ = fVar180 * auVar16._4_4_;
  auVar339._8_4_ = fVar196 * auVar16._8_4_;
  auVar339._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar19 = vfmadd231ps_fma(auVar339,(undefined1  [16])aVar5,auVar16);
  local_3f0 = vsubps_avx(auVar21,auVar15);
  auVar16 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar325._0_4_ = fVar75 * auVar16._0_4_;
  auVar325._4_4_ = fVar180 * auVar16._4_4_;
  auVar325._8_4_ = fVar196 * auVar16._8_4_;
  auVar325._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar186 = vfmadd231ps_fma(auVar325,(undefined1  [16])aVar5,auVar16);
  local_400 = vsubps_avx(_local_530,auVar15);
  auVar16 = vshufps_avx(local_400,local_400,0xaa);
  auVar168._0_4_ = fVar75 * auVar16._0_4_;
  auVar168._4_4_ = fVar180 * auVar16._4_4_;
  auVar168._8_4_ = fVar196 * auVar16._8_4_;
  auVar168._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_400,local_400,0x55);
  auVar142 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar16);
  local_410 = vsubps_avx(auVar107,auVar15);
  auVar16 = vshufps_avx(local_410,local_410,0xaa);
  auVar234._0_4_ = fVar75 * auVar16._0_4_;
  auVar234._4_4_ = fVar180 * auVar16._4_4_;
  auVar234._8_4_ = fVar196 * auVar16._8_4_;
  auVar234._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_410,local_410,0x55);
  auVar79 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar16);
  local_420 = vsubps_avx(auVar22,auVar15);
  auVar16 = vshufps_avx(local_420,local_420,0xaa);
  auVar278._0_4_ = fVar75 * auVar16._0_4_;
  auVar278._4_4_ = fVar180 * auVar16._4_4_;
  auVar278._8_4_ = fVar196 * auVar16._8_4_;
  auVar278._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_420,local_420,0x55);
  auVar16 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar5,auVar16);
  local_430 = vsubps_avx(auVar125,auVar15);
  auVar15 = vshufps_avx(local_430,local_430,0xaa);
  auVar187._0_4_ = fVar75 * auVar15._0_4_;
  auVar187._4_4_ = fVar180 * auVar15._4_4_;
  auVar187._8_4_ = fVar196 * auVar15._8_4_;
  auVar187._12_4_ = fVar139 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_430,local_430,0x55);
  auVar15 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar15);
  auVar204._4_4_ = local_4f0._0_4_;
  auVar204._0_4_ = local_4f0._0_4_;
  auVar204._8_4_ = local_4f0._0_4_;
  auVar204._12_4_ = local_4f0._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar80 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar204);
  auVar205._4_4_ = local_500._0_4_;
  auVar205._0_4_ = local_500._0_4_;
  auVar205._8_4_ = local_500._0_4_;
  auVar205._12_4_ = local_500._0_4_;
  auVar77 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar205);
  uVar76 = local_3e0._0_4_;
  auVar206._4_4_ = uVar76;
  auVar206._0_4_ = uVar76;
  auVar206._8_4_ = uVar76;
  auVar206._12_4_ = uVar76;
  auVar78 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar206);
  uVar76 = local_3f0._0_4_;
  auVar207._4_4_ = uVar76;
  auVar207._0_4_ = uVar76;
  auVar207._8_4_ = uVar76;
  auVar207._12_4_ = uVar76;
  auVar99 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar207);
  uVar76 = local_400._0_4_;
  auVar208._4_4_ = uVar76;
  auVar208._0_4_ = uVar76;
  auVar208._8_4_ = uVar76;
  auVar208._12_4_ = uVar76;
  auVar142 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar5,auVar208);
  uVar76 = local_410._0_4_;
  auVar209._4_4_ = uVar76;
  auVar209._0_4_ = uVar76;
  auVar209._8_4_ = uVar76;
  auVar209._12_4_ = uVar76;
  auVar79 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar209);
  uVar76 = local_420._0_4_;
  auVar210._4_4_ = uVar76;
  auVar210._0_4_ = uVar76;
  auVar210._8_4_ = uVar76;
  auVar210._12_4_ = uVar76;
  auVar100 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar210);
  uVar76 = local_430._0_4_;
  auVar211._4_4_ = uVar76;
  auVar211._0_4_ = uVar76;
  auVar211._8_4_ = uVar76;
  auVar211._12_4_ = uVar76;
  auVar101 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar211);
  auVar18 = vmovlhps_avx(auVar80,auVar142);
  auVar19 = vmovlhps_avx(auVar77,auVar79);
  auVar186 = vmovlhps_avx(auVar78,auVar100);
  _local_4e0 = vmovlhps_avx(auVar99,auVar101);
  auVar15 = vminps_avx(auVar18,auVar19);
  auVar16 = vminps_avx(auVar186,_local_4e0);
  auVar17 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar18,auVar19);
  auVar16 = vmaxps_avx(auVar186,_local_4e0);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vshufpd_avx(auVar17,auVar17,3);
  auVar17 = vminps_avx(auVar17,auVar16);
  auVar16 = vshufpd_avx(auVar15,auVar15,3);
  auVar16 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vandps_avx(auVar17,auVar345);
  auVar16 = vandps_avx(auVar16,auVar345);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar16,auVar15);
  local_2e0 = auVar15._0_4_ * 9.536743e-07;
  auVar212._8_8_ = auVar80._0_8_;
  auVar212._0_8_ = auVar80._0_8_;
  auVar254._8_8_ = auVar77._0_8_;
  auVar254._0_8_ = auVar77._0_8_;
  auVar289._8_8_ = auVar78._0_8_;
  auVar289._0_8_ = auVar78._0_8_;
  auVar326._0_8_ = auVar99._0_8_;
  auVar326._8_8_ = auVar326._0_8_;
  local_3d0 = ZEXT416((uint)local_2e0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  fStack_2f8 = -local_2e0;
  local_300 = -local_2e0;
  fStack_2fc = -local_2e0;
  fStack_2f4 = fStack_2f8;
  fStack_2f0 = fStack_2f8;
  fStack_2ec = fStack_2f8;
  fStack_2e8 = fStack_2f8;
  fStack_2e4 = fStack_2f8;
  local_320 = uVar67;
  uStack_31c = uVar67;
  uStack_318 = uVar67;
  uStack_314 = uVar67;
  uStack_310 = uVar67;
  uStack_30c = uVar67;
  uStack_308 = uVar67;
  uStack_304 = uVar67;
  local_340 = uVar7;
  uStack_33c = uVar7;
  uStack_338 = uVar7;
  uStack_334 = uVar7;
  uStack_330 = uVar7;
  uStack_32c = uVar7;
  uStack_328 = uVar7;
  uStack_324 = uVar7;
  uVar68 = 0;
  fVar75 = *(float *)(ray + k * 4 + 0x60);
  auVar15 = vsubps_avx(auVar19,auVar18);
  local_3b0 = vsubps_avx(auVar186,auVar19);
  local_3c0 = vsubps_avx(_local_4e0,auVar186);
  local_450 = vsubps_avx(_local_530,local_510);
  local_460 = vsubps_avx(auVar107,auVar20);
  local_470 = vsubps_avx(auVar22,local_520);
  _local_480 = vsubps_avx(auVar125,auVar21);
  local_780 = ZEXT816(0x3f80000000000000);
  local_440 = local_780;
  do {
    auVar16 = vshufps_avx(local_780,local_780,0x50);
    auVar148._8_4_ = 0x3f800000;
    auVar148._0_8_ = &DAT_3f8000003f800000;
    auVar148._12_4_ = 0x3f800000;
    auVar156._16_4_ = 0x3f800000;
    auVar156._0_16_ = auVar148;
    auVar156._20_4_ = 0x3f800000;
    auVar156._24_4_ = 0x3f800000;
    auVar156._28_4_ = 0x3f800000;
    auVar17 = vsubps_avx(auVar148,auVar16);
    fVar180 = auVar16._0_4_;
    fVar161 = auVar142._0_4_;
    auVar93._0_4_ = fVar161 * fVar180;
    fVar196 = auVar16._4_4_;
    fVar246 = auVar142._4_4_;
    auVar93._4_4_ = fVar246 * fVar196;
    fVar139 = auVar16._8_4_;
    auVar93._8_4_ = fVar161 * fVar139;
    fVar197 = auVar16._12_4_;
    auVar93._12_4_ = fVar246 * fVar197;
    fVar226 = auVar79._0_4_;
    auVar188._0_4_ = fVar226 * fVar180;
    fVar245 = auVar79._4_4_;
    auVar188._4_4_ = fVar245 * fVar196;
    auVar188._8_4_ = fVar226 * fVar139;
    auVar188._12_4_ = fVar245 * fVar197;
    fVar274 = auVar100._0_4_;
    auVar235._0_4_ = fVar274 * fVar180;
    fVar284 = auVar100._4_4_;
    auVar235._4_4_ = fVar284 * fVar196;
    auVar235._8_4_ = fVar274 * fVar139;
    auVar235._12_4_ = fVar284 * fVar197;
    fVar335 = auVar101._0_4_;
    auVar312._0_4_ = fVar335 * fVar180;
    fVar344 = auVar101._4_4_;
    auVar312._4_4_ = fVar344 * fVar196;
    auVar312._8_4_ = fVar335 * fVar139;
    auVar312._12_4_ = fVar344 * fVar197;
    auVar78 = vfmadd231ps_fma(auVar93,auVar17,auVar212);
    auVar99 = vfmadd231ps_fma(auVar188,auVar17,auVar254);
    auVar122 = vfmadd231ps_fma(auVar235,auVar17,auVar289);
    auVar257 = vfmadd231ps_fma(auVar312,auVar326,auVar17);
    local_6c0 = auVar257._0_4_;
    auVar16 = vmovshdup_avx(local_440);
    fVar180 = local_440._0_4_;
    fVar138 = (auVar16._0_4_ - fVar180) * 0.04761905;
    auVar267._4_4_ = fVar180;
    auVar267._0_4_ = fVar180;
    auVar267._8_4_ = fVar180;
    auVar267._12_4_ = fVar180;
    auVar267._16_4_ = fVar180;
    auVar267._20_4_ = fVar180;
    auVar267._24_4_ = fVar180;
    auVar267._28_4_ = fVar180;
    auVar134._0_8_ = auVar16._0_8_;
    auVar134._8_8_ = auVar134._0_8_;
    auVar134._16_8_ = auVar134._0_8_;
    auVar134._24_8_ = auVar134._0_8_;
    auVar96 = vsubps_avx(auVar134,auVar267);
    uVar76 = auVar78._0_4_;
    auVar351._4_4_ = uVar76;
    auVar351._0_4_ = uVar76;
    auVar351._8_4_ = uVar76;
    auVar351._12_4_ = uVar76;
    auVar351._16_4_ = uVar76;
    auVar351._20_4_ = uVar76;
    auVar351._24_4_ = uVar76;
    auVar351._28_4_ = uVar76;
    auVar16 = vmovshdup_avx(auVar78);
    uVar198 = auVar16._0_8_;
    auVar333._8_8_ = uVar198;
    auVar333._0_8_ = uVar198;
    auVar333._16_8_ = uVar198;
    auVar333._24_8_ = uVar198;
    fVar137 = auVar99._0_4_;
    auVar118._4_4_ = fVar137;
    auVar118._0_4_ = fVar137;
    auVar118._8_4_ = fVar137;
    auVar118._12_4_ = fVar137;
    auVar118._16_4_ = fVar137;
    auVar118._20_4_ = fVar137;
    auVar118._24_4_ = fVar137;
    auVar118._28_4_ = fVar137;
    auVar17 = vmovshdup_avx(auVar99);
    auVar217._0_8_ = auVar17._0_8_;
    auVar217._8_8_ = auVar217._0_8_;
    auVar217._16_8_ = auVar217._0_8_;
    auVar217._24_8_ = auVar217._0_8_;
    fVar268 = auVar122._0_4_;
    auVar308._4_4_ = fVar268;
    auVar308._0_4_ = fVar268;
    auVar308._8_4_ = fVar268;
    auVar308._12_4_ = fVar268;
    auVar308._16_4_ = fVar268;
    auVar308._20_4_ = fVar268;
    auVar308._24_4_ = fVar268;
    auVar308._28_4_ = fVar268;
    auVar80 = vmovshdup_avx(auVar122);
    auVar283._0_8_ = auVar80._0_8_;
    auVar283._8_8_ = auVar283._0_8_;
    auVar283._16_8_ = auVar283._0_8_;
    auVar283._24_8_ = auVar283._0_8_;
    auVar77 = vmovshdup_avx(auVar257);
    auVar123 = vfmadd132ps_fma(auVar96,auVar267,_DAT_02020f20);
    auVar96 = vsubps_avx(auVar156,ZEXT1632(auVar123));
    fVar180 = auVar123._0_4_;
    auVar341._0_4_ = fVar137 * fVar180;
    fVar196 = auVar123._4_4_;
    auVar341._4_4_ = fVar137 * fVar196;
    fVar139 = auVar123._8_4_;
    auVar341._8_4_ = fVar137 * fVar139;
    fVar197 = auVar123._12_4_;
    auVar341._12_4_ = fVar137 * fVar197;
    auVar341._16_4_ = fVar137 * 0.0;
    auVar341._20_4_ = fVar137 * 0.0;
    auVar341._24_4_ = fVar137 * 0.0;
    auVar341._28_4_ = 0;
    auVar123 = vfmadd231ps_fma(auVar341,auVar96,auVar351);
    fVar159 = auVar17._0_4_;
    auVar320._0_4_ = fVar159 * fVar180;
    fVar160 = auVar17._4_4_;
    auVar320._4_4_ = fVar160 * fVar196;
    auVar320._8_4_ = fVar159 * fVar139;
    auVar320._12_4_ = fVar160 * fVar197;
    auVar320._16_4_ = fVar159 * 0.0;
    auVar320._20_4_ = fVar160 * 0.0;
    auVar320._24_4_ = fVar159 * 0.0;
    auVar320._28_4_ = 0;
    auVar124 = vfmadd231ps_fma(auVar320,auVar96,auVar333);
    auVar24._4_4_ = fVar268 * fVar196;
    auVar24._0_4_ = fVar268 * fVar180;
    auVar24._8_4_ = fVar268 * fVar139;
    auVar24._12_4_ = fVar268 * fVar197;
    auVar24._16_4_ = fVar268 * 0.0;
    auVar24._20_4_ = fVar268 * 0.0;
    auVar24._24_4_ = fVar268 * 0.0;
    auVar24._28_4_ = auVar16._4_4_;
    auVar162 = vfmadd231ps_fma(auVar24,auVar96,auVar118);
    fVar159 = auVar80._0_4_;
    fVar160 = auVar80._4_4_;
    auVar98._4_4_ = fVar160 * fVar196;
    auVar98._0_4_ = fVar159 * fVar180;
    auVar98._8_4_ = fVar159 * fVar139;
    auVar98._12_4_ = fVar160 * fVar197;
    auVar98._16_4_ = fVar159 * 0.0;
    auVar98._20_4_ = fVar160 * 0.0;
    auVar98._24_4_ = fVar159 * 0.0;
    auVar98._28_4_ = uVar76;
    auVar171 = vfmadd231ps_fma(auVar98,auVar96,auVar217);
    auVar16 = vshufps_avx(auVar78,auVar78,0xaa);
    auVar218._0_8_ = auVar16._0_8_;
    auVar218._8_8_ = auVar218._0_8_;
    auVar218._16_8_ = auVar218._0_8_;
    auVar218._24_8_ = auVar218._0_8_;
    auVar17 = vshufps_avx(auVar78,auVar78,0xff);
    uStack_738 = auVar17._0_8_;
    local_740 = (undefined1  [8])uStack_738;
    uStack_730 = uStack_738;
    uStack_728 = uStack_738;
    auVar23._4_4_ = fVar196 * local_6c0;
    auVar23._0_4_ = fVar180 * local_6c0;
    auVar23._8_4_ = fVar139 * local_6c0;
    auVar23._12_4_ = fVar197 * local_6c0;
    auVar23._16_4_ = local_6c0 * 0.0;
    auVar23._20_4_ = local_6c0 * 0.0;
    auVar23._24_4_ = local_6c0 * 0.0;
    auVar23._28_4_ = 0x3f800000;
    auVar191 = vfmadd231ps_fma(auVar23,auVar96,auVar308);
    auVar80 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar178._0_8_ = auVar80._0_8_;
    auVar178._8_8_ = auVar178._0_8_;
    auVar178._16_8_ = auVar178._0_8_;
    auVar178._24_8_ = auVar178._0_8_;
    auVar78 = vshufps_avx(auVar99,auVar99,0xff);
    auVar195._0_8_ = auVar78._0_8_;
    auVar195._8_8_ = auVar195._0_8_;
    auVar195._16_8_ = auVar195._0_8_;
    auVar195._24_8_ = auVar195._0_8_;
    fVar159 = auVar77._0_4_;
    fVar160 = auVar77._4_4_;
    auVar25._4_4_ = fVar160 * fVar196;
    auVar25._0_4_ = fVar159 * fVar180;
    auVar25._8_4_ = fVar159 * fVar139;
    auVar25._12_4_ = fVar160 * fVar197;
    auVar25._16_4_ = fVar159 * 0.0;
    auVar25._20_4_ = fVar160 * 0.0;
    auVar25._24_4_ = fVar159 * 0.0;
    auVar25._28_4_ = fVar268;
    auVar199 = vfmadd231ps_fma(auVar25,auVar96,auVar283);
    auVar26._28_4_ = fVar137;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar162._12_4_ * fVar197,
                            CONCAT48(auVar162._8_4_ * fVar139,
                                     CONCAT44(auVar162._4_4_ * fVar196,auVar162._0_4_ * fVar180))));
    auVar123 = vfmadd231ps_fma(auVar26,auVar96,ZEXT1632(auVar123));
    auVar27._28_4_ = auVar17._4_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar171._12_4_ * fVar197,
                            CONCAT48(auVar171._8_4_ * fVar139,
                                     CONCAT44(auVar171._4_4_ * fVar196,auVar171._0_4_ * fVar180))));
    auVar124 = vfmadd231ps_fma(auVar27,auVar96,ZEXT1632(auVar124));
    auVar17 = vshufps_avx(auVar122,auVar122,0xaa);
    uVar198 = auVar17._0_8_;
    auVar321._8_8_ = uVar198;
    auVar321._0_8_ = uVar198;
    auVar321._16_8_ = uVar198;
    auVar321._24_8_ = uVar198;
    auVar77 = vshufps_avx(auVar122,auVar122,0xff);
    uVar198 = auVar77._0_8_;
    auVar342._8_8_ = uVar198;
    auVar342._0_8_ = uVar198;
    auVar342._16_8_ = uVar198;
    auVar342._24_8_ = uVar198;
    auVar162 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar191._12_4_,
                                                  CONCAT48(fVar139 * auVar191._8_4_,
                                                           CONCAT44(fVar196 * auVar191._4_4_,
                                                                    fVar180 * auVar191._0_4_)))),
                               auVar96,ZEXT1632(auVar162));
    auVar99 = vshufps_avx(auVar257,auVar257,0xaa);
    auVar122 = vshufps_avx(auVar257,auVar257,0xff);
    local_6c0 = auVar122._0_4_;
    fStack_6bc = auVar122._4_4_;
    auVar28._28_4_ = fStack_6bc;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar199._12_4_ * fVar197,
                            CONCAT48(auVar199._8_4_ * fVar139,
                                     CONCAT44(auVar199._4_4_ * fVar196,auVar199._0_4_ * fVar180))));
    auVar122 = vfmadd231ps_fma(auVar28,auVar96,ZEXT1632(auVar171));
    auVar257 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar162._12_4_,
                                                  CONCAT48(fVar139 * auVar162._8_4_,
                                                           CONCAT44(fVar196 * auVar162._4_4_,
                                                                    fVar180 * auVar162._0_4_)))),
                               auVar96,ZEXT1632(auVar123));
    auVar24 = vsubps_avx(ZEXT1632(auVar162),ZEXT1632(auVar123));
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar122._12_4_,
                                                  CONCAT48(fVar139 * auVar122._8_4_,
                                                           CONCAT44(fVar196 * auVar122._4_4_,
                                                                    fVar180 * auVar122._0_4_)))),
                               auVar96,ZEXT1632(auVar124));
    auVar97 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar124));
    fVar269 = fVar138 * auVar24._0_4_ * 3.0;
    fVar273 = fVar138 * auVar24._4_4_ * 3.0;
    auVar322._4_4_ = fVar273;
    auVar322._0_4_ = fVar269;
    fVar296 = fVar138 * auVar24._8_4_ * 3.0;
    auVar322._8_4_ = fVar296;
    fVar297 = fVar138 * auVar24._12_4_ * 3.0;
    auVar322._12_4_ = fVar297;
    fVar298 = fVar138 * auVar24._16_4_ * 3.0;
    auVar322._16_4_ = fVar298;
    fVar299 = fVar138 * auVar24._20_4_ * 3.0;
    auVar322._20_4_ = fVar299;
    fVar300 = fVar138 * auVar24._24_4_ * 3.0;
    auVar322._24_4_ = fVar300;
    auVar322._28_4_ = 0x40400000;
    local_760._0_4_ = fVar138 * auVar97._0_4_ * 3.0;
    local_760._4_4_ = fVar138 * auVar97._4_4_ * 3.0;
    fStack_758 = fVar138 * auVar97._8_4_ * 3.0;
    fStack_754 = fVar138 * auVar97._12_4_ * 3.0;
    fStack_750 = fVar138 * auVar97._16_4_ * 3.0;
    fStack_74c = fVar138 * auVar97._20_4_ * 3.0;
    fStack_748 = fVar138 * auVar97._24_4_ * 3.0;
    fStack_744 = auVar97._28_4_;
    fVar137 = auVar80._0_4_;
    fVar159 = auVar80._4_4_;
    auVar29._4_4_ = fVar159 * fVar196;
    auVar29._0_4_ = fVar137 * fVar180;
    auVar29._8_4_ = fVar137 * fVar139;
    auVar29._12_4_ = fVar159 * fVar197;
    auVar29._16_4_ = fVar137 * 0.0;
    auVar29._20_4_ = fVar159 * 0.0;
    auVar29._24_4_ = fVar137 * 0.0;
    auVar29._28_4_ = auVar24._28_4_;
    auVar80 = vfmadd231ps_fma(auVar29,auVar96,auVar218);
    fVar137 = auVar78._0_4_;
    fVar160 = auVar78._4_4_;
    auVar30._4_4_ = fVar160 * fVar196;
    auVar30._0_4_ = fVar137 * fVar180;
    auVar30._8_4_ = fVar137 * fVar139;
    auVar30._12_4_ = fVar160 * fVar197;
    auVar30._16_4_ = fVar137 * 0.0;
    auVar30._20_4_ = fVar160 * 0.0;
    auVar30._24_4_ = fVar137 * 0.0;
    auVar30._28_4_ = auVar16._4_4_;
    auVar16 = vfmadd231ps_fma(auVar30,auVar96,_local_740);
    fVar137 = auVar17._0_4_;
    fVar160 = auVar17._4_4_;
    auVar31._4_4_ = fVar160 * fVar196;
    auVar31._0_4_ = fVar137 * fVar180;
    auVar31._8_4_ = fVar137 * fVar139;
    auVar31._12_4_ = fVar160 * fVar197;
    auVar31._16_4_ = fVar137 * 0.0;
    auVar31._20_4_ = fVar160 * 0.0;
    auVar31._24_4_ = fVar137 * 0.0;
    auVar31._28_4_ = fVar138;
    auVar17 = vfmadd231ps_fma(auVar31,auVar96,auVar178);
    fVar137 = auVar77._0_4_;
    fVar268 = auVar77._4_4_;
    auVar32._4_4_ = fVar268 * fVar196;
    auVar32._0_4_ = fVar137 * fVar180;
    auVar32._8_4_ = fVar137 * fVar139;
    auVar32._12_4_ = fVar268 * fVar197;
    auVar32._16_4_ = fVar137 * 0.0;
    auVar32._20_4_ = fVar268 * 0.0;
    auVar32._24_4_ = fVar137 * 0.0;
    auVar32._28_4_ = fVar159;
    auVar77 = vfmadd231ps_fma(auVar32,auVar96,auVar195);
    auVar25 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar257));
    fVar137 = auVar99._0_4_;
    fVar159 = auVar99._4_4_;
    auVar33._4_4_ = fVar159 * fVar196;
    auVar33._0_4_ = fVar137 * fVar180;
    auVar33._8_4_ = fVar137 * fVar139;
    auVar33._12_4_ = fVar159 * fVar197;
    auVar33._16_4_ = fVar137 * 0.0;
    auVar33._20_4_ = fVar159 * 0.0;
    auVar33._24_4_ = fVar137 * 0.0;
    auVar33._28_4_ = auVar25._28_4_;
    auVar78 = vfmadd231ps_fma(auVar33,auVar96,auVar321);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar123));
    auVar34._4_4_ = fVar196 * fStack_6bc;
    auVar34._0_4_ = fVar180 * local_6c0;
    auVar34._8_4_ = fVar139 * local_6c0;
    auVar34._12_4_ = fVar197 * fStack_6bc;
    auVar34._16_4_ = local_6c0 * 0.0;
    auVar34._20_4_ = fStack_6bc * 0.0;
    auVar34._24_4_ = local_6c0 * 0.0;
    auVar34._28_4_ = fVar160;
    auVar99 = vfmadd231ps_fma(auVar34,auVar96,auVar342);
    auVar35._28_4_ = fVar159;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(fVar197 * auVar17._12_4_,
                            CONCAT48(fVar139 * auVar17._8_4_,
                                     CONCAT44(fVar196 * auVar17._4_4_,fVar180 * auVar17._0_4_))));
    auVar80 = vfmadd231ps_fma(auVar35,auVar96,ZEXT1632(auVar80));
    auVar16 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar77._12_4_,
                                                 CONCAT48(fVar139 * auVar77._8_4_,
                                                          CONCAT44(fVar196 * auVar77._4_4_,
                                                                   fVar180 * auVar77._0_4_)))),
                              auVar96,ZEXT1632(auVar16));
    fVar269 = auVar257._0_4_ + fVar269;
    fVar273 = auVar257._4_4_ + fVar273;
    fVar296 = auVar257._8_4_ + fVar296;
    fVar297 = auVar257._12_4_ + fVar297;
    fVar298 = fVar298 + 0.0;
    fVar299 = fVar299 + 0.0;
    fVar300 = fVar300 + 0.0;
    auVar36._28_4_ = 0x40400000;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar99._12_4_ * fVar197,
                            CONCAT48(auVar99._8_4_ * fVar139,
                                     CONCAT44(auVar99._4_4_ * fVar196,auVar99._0_4_ * fVar180))));
    auVar17 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar78._12_4_,
                                                 CONCAT48(fVar139 * auVar78._8_4_,
                                                          CONCAT44(fVar196 * auVar78._4_4_,
                                                                   fVar180 * auVar78._0_4_)))),
                              auVar96,ZEXT1632(auVar17));
    auVar77 = vfmadd231ps_fma(auVar36,auVar96,ZEXT1632(auVar77));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar17._12_4_,
                                                 CONCAT48(fVar139 * auVar17._8_4_,
                                                          CONCAT44(fVar196 * auVar17._4_4_,
                                                                   fVar180 * auVar17._0_4_)))),
                              auVar96,ZEXT1632(auVar80));
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar77._12_4_,
                                                 CONCAT48(fVar139 * auVar77._8_4_,
                                                          CONCAT44(fVar196 * auVar77._4_4_,
                                                                   fVar180 * auVar77._0_4_)))),
                              ZEXT1632(auVar16),auVar96);
    auVar96 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar80));
    auVar24 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar16));
    fVar180 = fVar138 * auVar96._0_4_ * 3.0;
    fVar196 = fVar138 * auVar96._4_4_ * 3.0;
    auVar37._4_4_ = fVar196;
    auVar37._0_4_ = fVar180;
    fVar139 = fVar138 * auVar96._8_4_ * 3.0;
    auVar37._8_4_ = fVar139;
    fVar197 = fVar138 * auVar96._12_4_ * 3.0;
    auVar37._12_4_ = fVar197;
    fVar268 = fVar138 * auVar96._16_4_ * 3.0;
    auVar37._16_4_ = fVar268;
    fVar270 = fVar138 * auVar96._20_4_ * 3.0;
    auVar37._20_4_ = fVar270;
    fVar272 = fVar138 * auVar96._24_4_ * 3.0;
    auVar37._24_4_ = fVar272;
    auVar37._28_4_ = 0x40400000;
    auVar244._0_4_ = fVar138 * auVar24._0_4_ * 3.0;
    auVar244._4_4_ = fVar138 * auVar24._4_4_ * 3.0;
    auVar244._8_4_ = fVar138 * auVar24._8_4_ * 3.0;
    auVar244._12_4_ = fVar138 * auVar24._12_4_ * 3.0;
    auVar244._16_4_ = fVar138 * auVar24._16_4_ * 3.0;
    auVar244._20_4_ = fVar138 * auVar24._20_4_ * 3.0;
    auVar244._24_4_ = fVar138 * auVar24._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar78));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar99));
    auVar96 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar257));
    auVar24 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar123));
    auVar98 = vsubps_avx(auVar27,auVar25);
    fVar271 = auVar96._0_4_ + auVar98._0_4_;
    fVar220 = auVar96._4_4_ + auVar98._4_4_;
    fVar221 = auVar96._8_4_ + auVar98._8_4_;
    fVar222 = auVar96._12_4_ + auVar98._12_4_;
    fVar223 = auVar96._16_4_ + auVar98._16_4_;
    fVar224 = auVar96._20_4_ + auVar98._20_4_;
    fVar225 = auVar96._24_4_ + auVar98._24_4_;
    auVar23 = vsubps_avx(local_1c0,auVar26);
    auVar334._0_4_ = auVar24._0_4_ + auVar23._0_4_;
    auVar334._4_4_ = auVar24._4_4_ + auVar23._4_4_;
    auVar334._8_4_ = auVar24._8_4_ + auVar23._8_4_;
    auVar334._12_4_ = auVar24._12_4_ + auVar23._12_4_;
    auVar334._16_4_ = auVar24._16_4_ + auVar23._16_4_;
    auVar334._20_4_ = auVar24._20_4_ + auVar23._20_4_;
    auVar334._24_4_ = auVar24._24_4_ + auVar23._24_4_;
    auVar334._28_4_ = auVar24._28_4_ + auVar23._28_4_;
    fVar138 = auVar123._0_4_;
    local_2a0 = fVar138 + (float)local_760._0_4_;
    fVar137 = auVar123._4_4_;
    fStack_29c = fVar137 + (float)local_760._4_4_;
    fVar159 = auVar123._8_4_;
    fStack_298 = fVar159 + fStack_758;
    fVar160 = auVar123._12_4_;
    fStack_294 = fVar160 + fStack_754;
    fStack_290 = fStack_750 + 0.0;
    fStack_28c = fStack_74c + 0.0;
    fStack_288 = fStack_748 + 0.0;
    fStack_284 = auVar97._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar257);
    auVar24 = vsubps_avx(local_1e0,auVar322);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar24);
    local_200 = ZEXT1632(auVar123);
    auVar24 = vsubps_avx(local_200,_local_760);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar24);
    local_240._0_4_ = auVar78._0_4_ + fVar180;
    local_240._4_4_ = auVar78._4_4_ + fVar196;
    local_240._8_4_ = auVar78._8_4_ + fVar139;
    local_240._12_4_ = auVar78._12_4_ + fVar197;
    local_240._16_4_ = fVar268 + 0.0;
    local_240._20_4_ = fVar270 + 0.0;
    local_240._24_4_ = fVar272 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar322 = ZEXT1632(auVar78);
    auVar24 = vsubps_avx(auVar322,auVar37);
    auVar28 = vpermps_avx2(_DAT_0205d4a0,auVar24);
    fVar180 = auVar99._0_4_;
    local_280._0_4_ = fVar180 + auVar244._0_4_;
    fVar196 = auVar99._4_4_;
    local_280._4_4_ = fVar196 + auVar244._4_4_;
    fVar139 = auVar99._8_4_;
    local_280._8_4_ = fVar139 + auVar244._8_4_;
    fVar197 = auVar99._12_4_;
    local_280._12_4_ = fVar197 + auVar244._12_4_;
    local_280._16_4_ = auVar244._16_4_ + 0.0;
    local_280._20_4_ = auVar244._20_4_ + 0.0;
    local_280._24_4_ = auVar244._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar24 = vsubps_avx(ZEXT1632(auVar99),auVar244);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar24);
    auVar38._4_4_ = fVar137 * fVar220;
    auVar38._0_4_ = fVar138 * fVar271;
    auVar38._8_4_ = fVar159 * fVar221;
    auVar38._12_4_ = fVar160 * fVar222;
    auVar38._16_4_ = fVar223 * 0.0;
    auVar38._20_4_ = fVar224 * 0.0;
    auVar38._24_4_ = fVar225 * 0.0;
    auVar38._28_4_ = auVar24._28_4_;
    auVar16 = vfnmadd231ps_fma(auVar38,local_1e0,auVar334);
    auVar39._4_4_ = fStack_29c * fVar220;
    auVar39._0_4_ = local_2a0 * fVar271;
    auVar39._8_4_ = fStack_298 * fVar221;
    auVar39._12_4_ = fStack_294 * fVar222;
    auVar39._16_4_ = fStack_290 * fVar223;
    auVar39._20_4_ = fStack_28c * fVar224;
    auVar39._24_4_ = fStack_288 * fVar225;
    auVar39._28_4_ = auVar28._28_4_;
    auVar54._4_4_ = fVar273;
    auVar54._0_4_ = fVar269;
    auVar54._8_4_ = fVar296;
    auVar54._12_4_ = fVar297;
    auVar54._16_4_ = fVar298;
    auVar54._20_4_ = fVar299;
    auVar54._24_4_ = fVar300;
    auVar54._28_4_ = 0x40400000;
    auVar17 = vfnmadd231ps_fma(auVar39,auVar334,auVar54);
    auVar40._4_4_ = local_2c0._4_4_ * fVar220;
    auVar40._0_4_ = local_2c0._0_4_ * fVar271;
    auVar40._8_4_ = local_2c0._8_4_ * fVar221;
    auVar40._12_4_ = local_2c0._12_4_ * fVar222;
    auVar40._16_4_ = local_2c0._16_4_ * fVar223;
    auVar40._20_4_ = local_2c0._20_4_ * fVar224;
    auVar40._24_4_ = local_2c0._24_4_ * fVar225;
    auVar40._28_4_ = fStack_284;
    auVar80 = vfnmadd231ps_fma(auVar40,local_220,auVar334);
    local_740._0_4_ = auVar26._0_4_;
    local_740._4_4_ = auVar26._4_4_;
    uStack_738._0_4_ = auVar26._8_4_;
    uStack_738._4_4_ = auVar26._12_4_;
    uStack_730._0_4_ = auVar26._16_4_;
    uStack_730._4_4_ = auVar26._20_4_;
    uStack_728._0_4_ = auVar26._24_4_;
    auVar41._4_4_ = fVar220 * (float)local_740._4_4_;
    auVar41._0_4_ = fVar271 * (float)local_740._0_4_;
    auVar41._8_4_ = fVar221 * (float)uStack_738;
    auVar41._12_4_ = fVar222 * uStack_738._4_4_;
    auVar41._16_4_ = fVar223 * (float)uStack_730;
    auVar41._20_4_ = fVar224 * uStack_730._4_4_;
    auVar41._24_4_ = fVar225 * (float)uStack_728;
    auVar41._28_4_ = local_2c0._28_4_;
    auVar77 = vfnmadd231ps_fma(auVar41,auVar25,auVar334);
    auVar60._4_4_ = fVar196 * fVar220;
    auVar60._0_4_ = fVar180 * fVar271;
    auVar60._8_4_ = fVar139 * fVar221;
    auVar60._12_4_ = fVar197 * fVar222;
    auVar60._16_4_ = fVar223 * 0.0;
    auVar60._20_4_ = fVar224 * 0.0;
    auVar60._24_4_ = fVar225 * 0.0;
    auVar60._28_4_ = DAT_0205d4a0._28_4_;
    auVar78 = vfnmadd231ps_fma(auVar60,auVar322,auVar334);
    auVar42._4_4_ = local_280._4_4_ * fVar220;
    auVar42._0_4_ = local_280._0_4_ * fVar271;
    auVar42._8_4_ = local_280._8_4_ * fVar221;
    auVar42._12_4_ = local_280._12_4_ * fVar222;
    auVar42._16_4_ = local_280._16_4_ * fVar223;
    auVar42._20_4_ = local_280._20_4_ * fVar224;
    auVar42._24_4_ = local_280._24_4_ * fVar225;
    auVar42._28_4_ = auVar25._28_4_;
    auVar122 = vfnmadd231ps_fma(auVar42,local_240,auVar334);
    auVar43._4_4_ = local_260._4_4_ * fVar220;
    auVar43._0_4_ = local_260._0_4_ * fVar271;
    auVar43._8_4_ = local_260._8_4_ * fVar221;
    auVar43._12_4_ = local_260._12_4_ * fVar222;
    auVar43._16_4_ = local_260._16_4_ * fVar223;
    auVar43._20_4_ = local_260._20_4_ * fVar224;
    auVar43._24_4_ = local_260._24_4_ * fVar225;
    auVar43._28_4_ = local_220._28_4_;
    auVar257 = vfnmadd231ps_fma(auVar43,auVar334,auVar28);
    auVar44._4_4_ = local_1c0._4_4_ * fVar220;
    auVar44._0_4_ = local_1c0._0_4_ * fVar271;
    auVar44._8_4_ = local_1c0._8_4_ * fVar221;
    auVar44._12_4_ = local_1c0._12_4_ * fVar222;
    auVar44._16_4_ = local_1c0._16_4_ * fVar223;
    auVar44._20_4_ = local_1c0._20_4_ * fVar224;
    auVar44._24_4_ = local_1c0._24_4_ * fVar225;
    auVar44._28_4_ = auVar96._28_4_ + auVar98._28_4_;
    auVar123 = vfnmadd231ps_fma(auVar44,auVar334,auVar27);
    auVar24 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar96 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar97 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
    auVar97 = vminps_avx(auVar24,auVar97);
    auVar24 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
    auVar96 = vmaxps_avx(auVar96,auVar24);
    auVar98 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar122));
    auVar24 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar122));
    auVar23 = vminps_avx(ZEXT1632(auVar257),ZEXT1632(auVar123));
    auVar98 = vminps_avx(auVar98,auVar23);
    auVar98 = vminps_avx(auVar97,auVar98);
    auVar97 = vmaxps_avx(ZEXT1632(auVar257),ZEXT1632(auVar123));
    auVar24 = vmaxps_avx(auVar24,auVar97);
    auVar24 = vmaxps_avx(auVar96,auVar24);
    auVar59._4_4_ = fStack_2dc;
    auVar59._0_4_ = local_2e0;
    auVar59._8_4_ = fStack_2d8;
    auVar59._12_4_ = fStack_2d4;
    auVar59._16_4_ = fStack_2d0;
    auVar59._20_4_ = fStack_2cc;
    auVar59._24_4_ = fStack_2c8;
    auVar59._28_4_ = fStack_2c4;
    auVar96 = vcmpps_avx(auVar98,auVar59,2);
    auVar58._4_4_ = fStack_2fc;
    auVar58._0_4_ = local_300;
    auVar58._8_4_ = fStack_2f8;
    auVar58._12_4_ = fStack_2f4;
    auVar58._16_4_ = fStack_2f0;
    auVar58._20_4_ = fStack_2ec;
    auVar58._24_4_ = fStack_2e8;
    auVar58._28_4_ = fStack_2e4;
    auVar24 = vcmpps_avx(auVar24,auVar58,5);
    auVar96 = vandps_avx(auVar24,auVar96);
    auVar24 = local_3a0 & auVar96;
    uVar65 = 0;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar24 = vsubps_avx(auVar25,local_1e0);
      auVar97 = vsubps_avx(auVar27,auVar322);
      fVar270 = auVar24._0_4_ + auVar97._0_4_;
      fVar272 = auVar24._4_4_ + auVar97._4_4_;
      fVar271 = auVar24._8_4_ + auVar97._8_4_;
      fVar220 = auVar24._12_4_ + auVar97._12_4_;
      fVar221 = auVar24._16_4_ + auVar97._16_4_;
      fVar222 = auVar24._20_4_ + auVar97._20_4_;
      fVar223 = auVar24._24_4_ + auVar97._24_4_;
      auVar98 = vsubps_avx(auVar26,local_200);
      auVar23 = vsubps_avx(local_1c0,ZEXT1632(auVar99));
      auVar119._0_4_ = auVar98._0_4_ + auVar23._0_4_;
      auVar119._4_4_ = auVar98._4_4_ + auVar23._4_4_;
      auVar119._8_4_ = auVar98._8_4_ + auVar23._8_4_;
      auVar119._12_4_ = auVar98._12_4_ + auVar23._12_4_;
      auVar119._16_4_ = auVar98._16_4_ + auVar23._16_4_;
      auVar119._20_4_ = auVar98._20_4_ + auVar23._20_4_;
      auVar119._24_4_ = auVar98._24_4_ + auVar23._24_4_;
      fVar268 = auVar23._28_4_;
      auVar119._28_4_ = auVar98._28_4_ + fVar268;
      auVar343._0_4_ = fVar138 * fVar270;
      auVar343._4_4_ = fVar137 * fVar272;
      auVar343._8_4_ = fVar159 * fVar271;
      auVar343._12_4_ = fVar160 * fVar220;
      auVar343._16_4_ = fVar221 * 0.0;
      auVar343._20_4_ = fVar222 * 0.0;
      auVar343._24_4_ = fVar223 * 0.0;
      auVar343._28_4_ = 0;
      auVar78 = vfnmadd231ps_fma(auVar343,auVar119,local_1e0);
      auVar45._4_4_ = fVar272 * fStack_29c;
      auVar45._0_4_ = fVar270 * local_2a0;
      auVar45._8_4_ = fVar271 * fStack_298;
      auVar45._12_4_ = fVar220 * fStack_294;
      auVar45._16_4_ = fVar221 * fStack_290;
      auVar45._20_4_ = fVar222 * fStack_28c;
      auVar45._24_4_ = fVar223 * fStack_288;
      auVar45._28_4_ = fVar268;
      auVar55._4_4_ = fVar273;
      auVar55._0_4_ = fVar269;
      auVar55._8_4_ = fVar296;
      auVar55._12_4_ = fVar297;
      auVar55._16_4_ = fVar298;
      auVar55._20_4_ = fVar299;
      auVar55._24_4_ = fVar300;
      auVar55._28_4_ = 0x40400000;
      auVar16 = vfnmadd213ps_fma(auVar55,auVar119,auVar45);
      auVar46._4_4_ = fVar272 * local_2c0._4_4_;
      auVar46._0_4_ = fVar270 * local_2c0._0_4_;
      auVar46._8_4_ = fVar271 * local_2c0._8_4_;
      auVar46._12_4_ = fVar220 * local_2c0._12_4_;
      auVar46._16_4_ = fVar221 * local_2c0._16_4_;
      auVar46._20_4_ = fVar222 * local_2c0._20_4_;
      auVar46._24_4_ = fVar223 * local_2c0._24_4_;
      auVar46._28_4_ = fVar268;
      auVar17 = vfnmadd213ps_fma(local_220,auVar119,auVar46);
      auVar47._4_4_ = (float)local_740._4_4_ * fVar272;
      auVar47._0_4_ = (float)local_740._0_4_ * fVar270;
      auVar47._8_4_ = (float)uStack_738 * fVar271;
      auVar47._12_4_ = uStack_738._4_4_ * fVar220;
      auVar47._16_4_ = (float)uStack_730 * fVar221;
      auVar47._20_4_ = uStack_730._4_4_ * fVar222;
      auVar47._24_4_ = (float)uStack_728 * fVar223;
      auVar47._28_4_ = fVar268;
      auVar99 = vfnmadd231ps_fma(auVar47,auVar119,auVar25);
      auVar135._0_4_ = fVar180 * fVar270;
      auVar135._4_4_ = fVar196 * fVar272;
      auVar135._8_4_ = fVar139 * fVar271;
      auVar135._12_4_ = fVar197 * fVar220;
      auVar135._16_4_ = fVar221 * 0.0;
      auVar135._20_4_ = fVar222 * 0.0;
      auVar135._24_4_ = fVar223 * 0.0;
      auVar135._28_4_ = 0;
      auVar122 = vfnmadd231ps_fma(auVar135,auVar119,auVar322);
      auVar48._4_4_ = fVar272 * local_280._4_4_;
      auVar48._0_4_ = fVar270 * local_280._0_4_;
      auVar48._8_4_ = fVar271 * local_280._8_4_;
      auVar48._12_4_ = fVar220 * local_280._12_4_;
      auVar48._16_4_ = fVar221 * local_280._16_4_;
      auVar48._20_4_ = fVar222 * local_280._20_4_;
      auVar48._24_4_ = fVar223 * local_280._24_4_;
      auVar48._28_4_ = auVar26._28_4_;
      auVar80 = vfnmadd213ps_fma(local_240,auVar119,auVar48);
      auVar49._4_4_ = fVar272 * local_260._4_4_;
      auVar49._0_4_ = fVar270 * local_260._0_4_;
      auVar49._8_4_ = fVar271 * local_260._8_4_;
      auVar49._12_4_ = fVar220 * local_260._12_4_;
      auVar49._16_4_ = fVar221 * local_260._16_4_;
      auVar49._20_4_ = fVar222 * local_260._20_4_;
      auVar49._24_4_ = fVar223 * local_260._24_4_;
      auVar49._28_4_ = auVar26._28_4_;
      auVar77 = vfnmadd213ps_fma(auVar28,auVar119,auVar49);
      auVar50._4_4_ = local_1c0._4_4_ * fVar272;
      auVar50._0_4_ = local_1c0._0_4_ * fVar270;
      auVar50._8_4_ = local_1c0._8_4_ * fVar271;
      auVar50._12_4_ = local_1c0._12_4_ * fVar220;
      auVar50._16_4_ = local_1c0._16_4_ * fVar221;
      auVar50._20_4_ = local_1c0._20_4_ * fVar222;
      auVar50._24_4_ = local_1c0._24_4_ * fVar223;
      auVar50._28_4_ = auVar24._28_4_ + auVar97._28_4_;
      auVar257 = vfnmadd231ps_fma(auVar50,auVar119,auVar27);
      auVar97 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar16));
      auVar24 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar16));
      auVar98 = vminps_avx(ZEXT1632(auVar17),ZEXT1632(auVar99));
      auVar98 = vminps_avx(auVar97,auVar98);
      auVar97 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar99));
      auVar24 = vmaxps_avx(auVar24,auVar97);
      auVar23 = vminps_avx(ZEXT1632(auVar122),ZEXT1632(auVar80));
      auVar97 = vmaxps_avx(ZEXT1632(auVar122),ZEXT1632(auVar80));
      auVar25 = vminps_avx(ZEXT1632(auVar77),ZEXT1632(auVar257));
      auVar23 = vminps_avx(auVar23,auVar25);
      auVar23 = vminps_avx(auVar98,auVar23);
      auVar98 = vmaxps_avx(ZEXT1632(auVar77),ZEXT1632(auVar257));
      auVar97 = vmaxps_avx(auVar97,auVar98);
      auVar97 = vmaxps_avx(auVar24,auVar97);
      auVar24 = vcmpps_avx(auVar23,auVar59,2);
      auVar97 = vcmpps_avx(auVar97,auVar58,5);
      auVar24 = vandps_avx(auVar97,auVar24);
      auVar96 = vandps_avx(auVar96,local_3a0);
      auVar97 = auVar96 & auVar24;
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0x7f,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar97 >> 0xbf,0) != '\0') ||
          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar97[0x1f] < '\0') {
        auVar96 = vandps_avx(auVar24,auVar96);
        uVar65 = vmovmskps_avx(auVar96);
      }
    }
    if (uVar65 != 0) {
      auStack_4d0[uVar68] = uVar65;
      uVar198 = vmovlps_avx(local_440);
      *(undefined8 *)(&uStack_380 + uVar68 * 2) = uVar198;
      uVar73 = vmovlps_avx(local_780);
      auStack_1a0[uVar68] = uVar73;
      uVar68 = (ulong)((int)uVar68 + 1);
    }
    do {
      if ((int)uVar68 == 0) {
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar95._4_4_ = uVar76;
        auVar95._0_4_ = uVar76;
        auVar95._8_4_ = uVar76;
        auVar95._12_4_ = uVar76;
        auVar15 = vcmpps_avx(local_490,auVar95,2);
        uVar67 = vmovmskps_avx(auVar15);
        uVar63 = uVar63 & uVar63 + 0xf & uVar67;
        if (uVar63 == 0) {
          return;
        }
        goto LAB_017eca0e;
      }
      uVar66 = (int)uVar68 - 1;
      uVar69 = (ulong)uVar66;
      uVar72 = auStack_4d0[uVar69];
      uVar65 = (&uStack_380)[uVar69 * 2];
      fVar180 = afStack_37c[uVar69 * 2];
      iVar64 = 0;
      for (uVar73 = (ulong)uVar72; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        iVar64 = iVar64 + 1;
      }
      uVar72 = uVar72 - 1 & uVar72;
      if (uVar72 == 0) {
        uVar68 = (ulong)uVar66;
      }
      local_780._8_8_ = 0;
      local_780._0_8_ = auStack_1a0[uVar69];
      auStack_4d0[uVar69] = uVar72;
      fVar196 = (float)(iVar64 + 1) * 0.14285715;
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * (float)iVar64 * 0.14285715)),
                                ZEXT416(uVar65),ZEXT416((uint)(1.0 - (float)iVar64 * 0.14285715)));
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar196)),ZEXT416(uVar65),
                                ZEXT416((uint)(1.0 - fVar196)));
      auVar219._0_4_ = auVar16._0_4_;
      fVar196 = auVar17._0_4_;
      fVar180 = fVar196 - auVar219._0_4_;
      if (0.16666667 <= fVar180) break;
      auVar80 = vshufps_avx(local_780,local_780,0x50);
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = &DAT_3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar77 = vsubps_avx(auVar128,auVar80);
      fVar139 = auVar80._0_4_;
      auVar149._0_4_ = fVar139 * fVar161;
      fVar197 = auVar80._4_4_;
      auVar149._4_4_ = fVar197 * fVar246;
      fVar138 = auVar80._8_4_;
      auVar149._8_4_ = fVar138 * fVar161;
      fVar137 = auVar80._12_4_;
      auVar149._12_4_ = fVar137 * fVar246;
      auVar169._0_4_ = fVar139 * fVar226;
      auVar169._4_4_ = fVar197 * fVar245;
      auVar169._8_4_ = fVar138 * fVar226;
      auVar169._12_4_ = fVar137 * fVar245;
      auVar189._0_4_ = fVar139 * fVar274;
      auVar189._4_4_ = fVar197 * fVar284;
      auVar189._8_4_ = fVar138 * fVar274;
      auVar189._12_4_ = fVar137 * fVar284;
      auVar111._0_4_ = fVar139 * fVar335;
      auVar111._4_4_ = fVar197 * fVar344;
      auVar111._8_4_ = fVar138 * fVar335;
      auVar111._12_4_ = fVar137 * fVar344;
      auVar80 = vfmadd231ps_fma(auVar149,auVar77,auVar212);
      auVar78 = vfmadd231ps_fma(auVar169,auVar77,auVar254);
      auVar99 = vfmadd231ps_fma(auVar189,auVar77,auVar289);
      auVar77 = vfmadd231ps_fma(auVar111,auVar77,auVar326);
      auVar136._16_16_ = auVar80;
      auVar136._0_16_ = auVar80;
      auVar157._16_16_ = auVar78;
      auVar157._0_16_ = auVar78;
      auVar179._16_16_ = auVar99;
      auVar179._0_16_ = auVar99;
      auVar219._4_4_ = auVar219._0_4_;
      auVar219._8_4_ = auVar219._0_4_;
      auVar219._12_4_ = auVar219._0_4_;
      auVar219._20_4_ = fVar196;
      auVar219._16_4_ = fVar196;
      auVar219._24_4_ = fVar196;
      auVar219._28_4_ = fVar196;
      auVar96 = vsubps_avx(auVar157,auVar136);
      auVar78 = vfmadd213ps_fma(auVar96,auVar219,auVar136);
      auVar96 = vsubps_avx(auVar179,auVar157);
      auVar122 = vfmadd213ps_fma(auVar96,auVar219,auVar157);
      auVar80 = vsubps_avx(auVar77,auVar99);
      auVar158._16_16_ = auVar80;
      auVar158._0_16_ = auVar80;
      auVar80 = vfmadd213ps_fma(auVar158,auVar219,auVar179);
      auVar96 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar78));
      auVar77 = vfmadd213ps_fma(auVar96,auVar219,ZEXT1632(auVar78));
      auVar96 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar122));
      auVar80 = vfmadd213ps_fma(auVar96,auVar219,ZEXT1632(auVar122));
      auVar96 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
      auVar124 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar96,auVar219);
      fVar160 = auVar96._4_4_ * 3.0;
      fVar159 = fVar180 * 0.33333334;
      auVar290._0_8_ =
           CONCAT44(auVar124._4_4_ + fVar159 * fVar160,
                    auVar124._0_4_ + fVar159 * auVar96._0_4_ * 3.0);
      auVar290._8_4_ = auVar124._8_4_ + fVar159 * auVar96._8_4_ * 3.0;
      auVar290._12_4_ = auVar124._12_4_ + fVar159 * auVar96._12_4_ * 3.0;
      auVar77 = vshufpd_avx(auVar124,auVar124,3);
      auVar78 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar80 = vsubps_avx(auVar77,auVar124);
      auVar99 = vsubps_avx(auVar78,(undefined1  [16])0x0);
      auVar129._0_4_ = auVar80._0_4_ + auVar99._0_4_;
      auVar129._4_4_ = auVar80._4_4_ + auVar99._4_4_;
      auVar129._8_4_ = auVar80._8_4_ + auVar99._8_4_;
      auVar129._12_4_ = auVar80._12_4_ + auVar99._12_4_;
      auVar80 = vshufps_avx(auVar124,auVar124,0xb1);
      auVar99 = vshufps_avx(auVar290,auVar290,0xb1);
      auVar327._4_4_ = auVar129._0_4_;
      auVar327._0_4_ = auVar129._0_4_;
      auVar327._8_4_ = auVar129._0_4_;
      auVar327._12_4_ = auVar129._0_4_;
      auVar122 = vshufps_avx(auVar129,auVar129,0x55);
      fVar139 = auVar122._0_4_;
      auVar236._0_4_ = auVar80._0_4_ * fVar139;
      fVar197 = auVar122._4_4_;
      auVar236._4_4_ = auVar80._4_4_ * fVar197;
      fVar138 = auVar122._8_4_;
      auVar236._8_4_ = auVar80._8_4_ * fVar138;
      fVar137 = auVar122._12_4_;
      auVar236._12_4_ = auVar80._12_4_ * fVar137;
      auVar255._0_4_ = auVar99._0_4_ * fVar139;
      auVar255._4_4_ = auVar99._4_4_ * fVar197;
      auVar255._8_4_ = auVar99._8_4_ * fVar138;
      auVar255._12_4_ = auVar99._12_4_ * fVar137;
      auVar257 = vfmadd231ps_fma(auVar236,auVar327,auVar124);
      auVar123 = vfmadd231ps_fma(auVar255,auVar327,auVar290);
      auVar99 = vshufps_avx(auVar257,auVar257,0xe8);
      auVar122 = vshufps_avx(auVar123,auVar123,0xe8);
      auVar80 = vcmpps_avx(auVar99,auVar122,1);
      uVar65 = vextractps_avx(auVar80,0);
      auVar162 = auVar123;
      if ((uVar65 & 1) == 0) {
        auVar162 = auVar257;
      }
      auVar170._0_4_ = fVar159 * auVar96._16_4_ * 3.0;
      auVar170._4_4_ = fVar159 * fVar160;
      auVar170._8_4_ = fVar159 * auVar96._24_4_ * 3.0;
      auVar170._12_4_ = fVar159 * fVar196;
      auVar227 = vsubps_avx((undefined1  [16])0x0,auVar170);
      auVar171 = vshufps_avx(auVar227,auVar227,0xb1);
      auVar191 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar348._0_4_ = auVar171._0_4_ * fVar139;
      auVar348._4_4_ = auVar171._4_4_ * fVar197;
      auVar348._8_4_ = auVar171._8_4_ * fVar138;
      auVar348._12_4_ = auVar171._12_4_ * fVar137;
      auVar130._0_4_ = auVar191._0_4_ * fVar139;
      auVar130._4_4_ = auVar191._4_4_ * fVar197;
      auVar130._8_4_ = auVar191._8_4_ * fVar138;
      auVar130._12_4_ = auVar191._12_4_ * fVar137;
      auVar228 = vfmadd231ps_fma(auVar348,auVar327,auVar227);
      auVar247 = vfmadd231ps_fma(auVar130,(undefined1  [16])0x0,auVar327);
      auVar191 = vshufps_avx(auVar228,auVar228,0xe8);
      auVar199 = vshufps_avx(auVar247,auVar247,0xe8);
      auVar171 = vcmpps_avx(auVar191,auVar199,1);
      uVar65 = vextractps_avx(auVar171,0);
      auVar248 = auVar247;
      if ((uVar65 & 1) == 0) {
        auVar248 = auVar228;
      }
      auVar162 = vmaxss_avx(auVar248,auVar162);
      auVar99 = vminps_avx(auVar99,auVar122);
      auVar122 = vminps_avx(auVar191,auVar199);
      auVar122 = vminps_avx(auVar99,auVar122);
      auVar80 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vblendps_avx(auVar80,auVar171,2);
      auVar171 = vpslld_avx(auVar80,0x1f);
      auVar80 = vshufpd_avx(auVar123,auVar123,1);
      auVar80 = vinsertps_avx(auVar80,auVar247,0x9c);
      auVar99 = vshufpd_avx(auVar257,auVar257,1);
      auVar99 = vinsertps_avx(auVar99,auVar228,0x9c);
      auVar80 = vblendvps_avx(auVar99,auVar80,auVar171);
      auVar99 = vmovshdup_avx(auVar80);
      auVar80 = vmaxss_avx(auVar99,auVar80);
      fVar138 = auVar122._0_4_;
      auVar99 = vmovshdup_avx(auVar122);
      fVar197 = auVar80._0_4_;
      fVar139 = auVar162._0_4_;
      if ((0.0001 <= fVar138) || (fVar197 <= -0.0001)) {
        auVar257 = vcmpps_avx(auVar99,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar123 = vcmpps_avx(auVar122,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar257 = vorps_avx(auVar123,auVar257);
        if ((-0.0001 < fVar139 & auVar257[0]) != 0) goto LAB_017edf79;
        auVar257 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar80,5);
        auVar123 = vcmpps_avx(auVar99,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar257 = vorps_avx(auVar123,auVar257);
        if ((auVar257 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_017edf79;
LAB_017ee92b:
        bVar51 = true;
      }
      else {
LAB_017edf79:
        auVar123 = vcmpps_avx(auVar122,_DAT_01feba10,1);
        auVar171 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar257 = vcmpss_avx(auVar162,ZEXT816(0) << 0x20,1);
        auVar190._8_4_ = 0x3f800000;
        auVar190._0_8_ = &DAT_3f8000003f800000;
        auVar190._12_4_ = 0x3f800000;
        auVar256._8_4_ = 0xbf800000;
        auVar256._0_8_ = 0xbf800000bf800000;
        auVar256._12_4_ = 0xbf800000;
        auVar257 = vblendvps_avx(auVar190,auVar256,auVar257);
        auVar123 = vblendvps_avx(auVar190,auVar256,auVar123);
        fVar137 = auVar123._0_4_;
        fVar159 = auVar257._0_4_;
        auVar257 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar137 == fVar159) && (!NAN(fVar137) && !NAN(fVar159))) {
          auVar257 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar191 = ZEXT816(0) << 0x20;
        if ((fVar137 == fVar159) && (!NAN(fVar137) && !NAN(fVar159))) {
          auVar171 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar123 = vmovshdup_avx(auVar123);
        fVar160 = auVar123._0_4_;
        if ((fVar137 != fVar160) || (NAN(fVar137) || NAN(fVar160))) {
          fVar137 = auVar99._0_4_;
          if ((fVar137 != fVar138) || (NAN(fVar137) || NAN(fVar138))) {
            auVar131._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar131._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar131._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar172._0_4_ = -fVar138 / (fVar137 - fVar138);
            auVar172._4_12_ = auVar131._4_12_;
            auVar99 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar172._0_4_)),auVar191,auVar172);
            auVar122 = auVar99;
          }
          else {
            auVar99 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar138 == 0.0) && (auVar99 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar138))) {
              auVar99 = ZEXT816(0);
            }
            auVar122 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar138 == 0.0) && (auVar122 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar138))) {
              auVar122 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar257 = vminss_avx(auVar257,auVar99);
          auVar171 = vmaxss_avx(auVar122,auVar171);
        }
        auVar80 = vcmpss_avx(auVar80,auVar191,1);
        auVar173._8_4_ = 0x3f800000;
        auVar173._0_8_ = &DAT_3f8000003f800000;
        auVar173._12_4_ = 0x3f800000;
        auVar313._8_4_ = 0xbf800000;
        auVar313._0_8_ = 0xbf800000bf800000;
        auVar313._12_4_ = 0xbf800000;
        auVar80 = vblendvps_avx(auVar173,auVar313,auVar80);
        fVar138 = auVar80._0_4_;
        auVar80 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar159 != fVar138) || (NAN(fVar159) || NAN(fVar138))) {
          if ((fVar197 != fVar139) || (NAN(fVar197) || NAN(fVar139))) {
            auVar132._0_8_ = auVar162._0_8_ ^ 0x8000000080000000;
            auVar132._8_4_ = auVar162._8_4_ ^ 0x80000000;
            auVar132._12_4_ = auVar162._12_4_ ^ 0x80000000;
            auVar174._0_4_ = -fVar139 / (fVar197 - fVar139);
            auVar174._4_12_ = auVar132._4_12_;
            auVar99 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar174._0_4_)),auVar191,auVar174);
            auVar122 = auVar99;
          }
          else {
            auVar99 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar139 == 0.0) && (auVar99 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar139))) {
              auVar99 = ZEXT816(0);
            }
            auVar122 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar139 == 0.0) && (auVar122 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar139))) {
              auVar122 = auVar80;
            }
          }
          auVar257 = vminss_avx(auVar257,auVar99);
          auVar171 = vmaxss_avx(auVar122,auVar171);
        }
        if ((fVar160 != fVar138) || (NAN(fVar160) || NAN(fVar138))) {
          auVar257 = vminss_avx(auVar257,auVar80);
          auVar171 = vmaxss_avx(auVar80,auVar171);
        }
        auVar99 = vmaxss_avx(auVar191,auVar257);
        auVar122 = vminss_avx(auVar171,auVar80);
        bVar51 = true;
        if (auVar99._0_4_ <= auVar122._0_4_) {
          auVar99 = vmaxss_avx(auVar191,ZEXT416((uint)(auVar99._0_4_ + -0.1)));
          auVar80 = vminss_avx(ZEXT416((uint)(auVar122._0_4_ + 0.1)),auVar80);
          auVar112._0_8_ = auVar124._0_8_;
          auVar112._8_8_ = auVar112._0_8_;
          auVar258._8_8_ = auVar290._0_8_;
          auVar258._0_8_ = auVar290._0_8_;
          auVar279._8_8_ = auVar227._0_8_;
          auVar279._0_8_ = auVar227._0_8_;
          auVar122 = vshufpd_avx(auVar290,auVar290,3);
          auVar257 = vshufpd_avx(auVar227,auVar227,3);
          auVar123 = vshufps_avx(auVar99,auVar80,0);
          auVar150._8_4_ = 0x3f800000;
          auVar150._0_8_ = &DAT_3f8000003f800000;
          auVar150._12_4_ = 0x3f800000;
          auVar124 = vsubps_avx(auVar150,auVar123);
          local_760._0_4_ = auVar77._0_4_;
          local_760._4_4_ = auVar77._4_4_;
          fStack_758 = auVar77._8_4_;
          fStack_754 = auVar77._12_4_;
          fVar139 = auVar123._0_4_;
          auVar151._0_4_ = fVar139 * (float)local_760._0_4_;
          fVar197 = auVar123._4_4_;
          auVar151._4_4_ = fVar197 * (float)local_760._4_4_;
          fVar138 = auVar123._8_4_;
          auVar151._8_4_ = fVar138 * fStack_758;
          fVar137 = auVar123._12_4_;
          auVar151._12_4_ = fVar137 * fStack_754;
          auVar175._0_4_ = auVar122._0_4_ * fVar139;
          auVar175._4_4_ = auVar122._4_4_ * fVar197;
          auVar175._8_4_ = auVar122._8_4_ * fVar138;
          auVar175._12_4_ = auVar122._12_4_ * fVar137;
          auVar192._0_4_ = auVar257._0_4_ * fVar139;
          auVar192._4_4_ = auVar257._4_4_ * fVar197;
          auVar192._8_4_ = auVar257._8_4_ * fVar138;
          auVar192._12_4_ = auVar257._12_4_ * fVar137;
          local_740._0_4_ = auVar78._0_4_;
          local_740._4_4_ = auVar78._4_4_;
          uStack_738._0_4_ = auVar78._8_4_;
          uStack_738._4_4_ = auVar78._12_4_;
          auVar213._0_4_ = fVar139 * (float)local_740._0_4_;
          auVar213._4_4_ = fVar197 * (float)local_740._4_4_;
          auVar213._8_4_ = fVar138 * (float)uStack_738;
          auVar213._12_4_ = fVar137 * uStack_738._4_4_;
          auVar122 = vfmadd231ps_fma(auVar151,auVar124,auVar112);
          auVar257 = vfmadd231ps_fma(auVar175,auVar124,auVar258);
          auVar123 = vfmadd231ps_fma(auVar192,auVar124,auVar279);
          auVar124 = vfmadd231ps_fma(auVar213,auVar124,ZEXT816(0));
          auVar77 = vmovshdup_avx(local_780);
          auVar191 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar99._0_4_)),local_780,
                                     ZEXT416((uint)(1.0 - auVar99._0_4_)));
          auVar199 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar80._0_4_)),local_780,
                                     ZEXT416((uint)(1.0 - auVar80._0_4_)));
          fVar139 = 1.0 / fVar180;
          auVar80 = vsubps_avx(auVar257,auVar122);
          auVar237._0_4_ = auVar80._0_4_ * 3.0;
          auVar237._4_4_ = auVar80._4_4_ * 3.0;
          auVar237._8_4_ = auVar80._8_4_ * 3.0;
          auVar237._12_4_ = auVar80._12_4_ * 3.0;
          auVar80 = vsubps_avx(auVar123,auVar257);
          auVar259._0_4_ = auVar80._0_4_ * 3.0;
          auVar259._4_4_ = auVar80._4_4_ * 3.0;
          auVar259._8_4_ = auVar80._8_4_ * 3.0;
          auVar259._12_4_ = auVar80._12_4_ * 3.0;
          auVar80 = vsubps_avx(auVar124,auVar123);
          auVar280._0_4_ = auVar80._0_4_ * 3.0;
          auVar280._4_4_ = auVar80._4_4_ * 3.0;
          auVar280._8_4_ = auVar80._8_4_ * 3.0;
          auVar280._12_4_ = auVar80._12_4_ * 3.0;
          auVar77 = vminps_avx(auVar259,auVar280);
          auVar80 = vmaxps_avx(auVar259,auVar280);
          auVar77 = vminps_avx(auVar237,auVar77);
          auVar80 = vmaxps_avx(auVar237,auVar80);
          auVar78 = vshufpd_avx(auVar77,auVar77,3);
          auVar99 = vshufpd_avx(auVar80,auVar80,3);
          auVar77 = vminps_avx(auVar77,auVar78);
          auVar80 = vmaxps_avx(auVar80,auVar99);
          auVar260._0_4_ = auVar77._0_4_ * fVar139;
          auVar260._4_4_ = auVar77._4_4_ * fVar139;
          auVar260._8_4_ = auVar77._8_4_ * fVar139;
          auVar260._12_4_ = auVar77._12_4_ * fVar139;
          auVar238._0_4_ = fVar139 * auVar80._0_4_;
          auVar238._4_4_ = fVar139 * auVar80._4_4_;
          auVar238._8_4_ = fVar139 * auVar80._8_4_;
          auVar238._12_4_ = fVar139 * auVar80._12_4_;
          fVar139 = 1.0 / (auVar199._0_4_ - auVar191._0_4_);
          auVar80 = vshufpd_avx(auVar122,auVar122,3);
          auVar77 = vshufpd_avx(auVar257,auVar257,3);
          auVar78 = vshufpd_avx(auVar123,auVar123,3);
          auVar99 = vshufpd_avx(auVar124,auVar124,3);
          auVar80 = vsubps_avx(auVar80,auVar122);
          auVar122 = vsubps_avx(auVar77,auVar257);
          auVar257 = vsubps_avx(auVar78,auVar123);
          auVar99 = vsubps_avx(auVar99,auVar124);
          auVar77 = vminps_avx(auVar80,auVar122);
          auVar80 = vmaxps_avx(auVar80,auVar122);
          auVar78 = vminps_avx(auVar257,auVar99);
          auVar78 = vminps_avx(auVar77,auVar78);
          auVar77 = vmaxps_avx(auVar257,auVar99);
          auVar80 = vmaxps_avx(auVar80,auVar77);
          auVar303._0_4_ = fVar139 * auVar78._0_4_;
          auVar303._4_4_ = fVar139 * auVar78._4_4_;
          auVar303._8_4_ = fVar139 * auVar78._8_4_;
          auVar303._12_4_ = fVar139 * auVar78._12_4_;
          auVar291._0_4_ = fVar139 * auVar80._0_4_;
          auVar291._4_4_ = fVar139 * auVar80._4_4_;
          auVar291._8_4_ = fVar139 * auVar80._8_4_;
          auVar291._12_4_ = fVar139 * auVar80._12_4_;
          auVar99 = vinsertps_avx(auVar16,auVar191,0x10);
          auVar122 = vinsertps_avx(auVar17,auVar199,0x10);
          auVar94._0_4_ = (auVar99._0_4_ + auVar122._0_4_) * 0.5;
          auVar94._4_4_ = (auVar99._4_4_ + auVar122._4_4_) * 0.5;
          auVar94._8_4_ = (auVar99._8_4_ + auVar122._8_4_) * 0.5;
          auVar94._12_4_ = (auVar99._12_4_ + auVar122._12_4_) * 0.5;
          auVar152._4_4_ = auVar94._0_4_;
          auVar152._0_4_ = auVar94._0_4_;
          auVar152._8_4_ = auVar94._0_4_;
          auVar152._12_4_ = auVar94._0_4_;
          auVar80 = vfmadd213ps_fma(auVar15,auVar152,auVar18);
          auVar77 = vfmadd213ps_fma(local_3b0,auVar152,auVar19);
          auVar78 = vfmadd213ps_fma(local_3c0,auVar152,auVar186);
          auVar17 = vsubps_avx(auVar77,auVar80);
          auVar80 = vfmadd213ps_fma(auVar17,auVar152,auVar80);
          auVar17 = vsubps_avx(auVar78,auVar77);
          auVar17 = vfmadd213ps_fma(auVar17,auVar152,auVar77);
          auVar17 = vsubps_avx(auVar17,auVar80);
          auVar80 = vfmadd231ps_fma(auVar80,auVar17,auVar152);
          auVar153._0_8_ = CONCAT44(auVar17._4_4_ * 3.0,auVar17._0_4_ * 3.0);
          auVar153._8_4_ = auVar17._8_4_ * 3.0;
          auVar153._12_4_ = auVar17._12_4_ * 3.0;
          auVar281._8_8_ = auVar80._0_8_;
          auVar281._0_8_ = auVar80._0_8_;
          auVar17 = vshufpd_avx(auVar80,auVar80,3);
          auVar80 = vshufps_avx(auVar94,auVar94,0x55);
          auVar257 = vsubps_avx(auVar17,auVar281);
          auVar124 = vfmadd231ps_fma(auVar281,auVar80,auVar257);
          auVar328._8_8_ = auVar153._0_8_;
          auVar328._0_8_ = auVar153._0_8_;
          auVar17 = vshufpd_avx(auVar153,auVar153,3);
          auVar17 = vsubps_avx(auVar17,auVar328);
          auVar123 = vfmadd213ps_fma(auVar17,auVar80,auVar328);
          auVar80 = vmovshdup_avx(auVar123);
          auVar329._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
          auVar329._8_4_ = auVar80._8_4_ ^ 0x80000000;
          auVar329._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar77 = vmovshdup_avx(auVar257);
          auVar17 = vunpcklps_avx(auVar77,auVar329);
          auVar78 = vshufps_avx(auVar17,auVar329,4);
          auVar349._0_8_ = auVar257._0_8_ ^ 0x8000000080000000;
          auVar349._8_4_ = auVar257._8_4_ ^ 0x80000000;
          auVar349._12_4_ = auVar257._12_4_ ^ 0x80000000;
          auVar17 = vmovlhps_avx(auVar349,auVar123);
          auVar17 = vshufps_avx(auVar17,auVar123,8);
          auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar257._0_4_)),auVar77,auVar123
                                   );
          auVar176._0_4_ = auVar80._0_4_;
          auVar176._4_4_ = auVar176._0_4_;
          auVar176._8_4_ = auVar176._0_4_;
          auVar176._12_4_ = auVar176._0_4_;
          auVar80 = vdivps_avx(auVar78,auVar176);
          auVar77 = vdivps_avx(auVar17,auVar176);
          fVar138 = auVar124._0_4_;
          fVar139 = auVar80._0_4_;
          auVar17 = vshufps_avx(auVar124,auVar124,0x55);
          fVar197 = auVar77._0_4_;
          local_740._4_4_ = fVar138 * auVar80._4_4_ + auVar17._4_4_ * auVar77._4_4_;
          local_740._0_4_ = fVar138 * fVar139 + auVar17._0_4_ * fVar197;
          uStack_738._0_4_ = fVar138 * auVar80._8_4_ + auVar17._8_4_ * auVar77._8_4_;
          uStack_738._4_4_ = fVar138 * auVar80._12_4_ + auVar17._12_4_ * auVar77._12_4_;
          auVar257 = vmovshdup_avx(auVar80);
          auVar17 = vinsertps_avx(auVar260,auVar303,0x1c);
          auVar340._0_4_ = auVar257._0_4_ * auVar17._0_4_;
          auVar340._4_4_ = auVar257._4_4_ * auVar17._4_4_;
          auVar340._8_4_ = auVar257._8_4_ * auVar17._8_4_;
          auVar340._12_4_ = auVar257._12_4_ * auVar17._12_4_;
          auVar78 = vinsertps_avx(auVar238,auVar291,0x1c);
          auVar314._0_4_ = auVar257._0_4_ * auVar78._0_4_;
          auVar314._4_4_ = auVar257._4_4_ * auVar78._4_4_;
          auVar314._8_4_ = auVar257._8_4_ * auVar78._8_4_;
          auVar314._12_4_ = auVar257._12_4_ * auVar78._12_4_;
          auVar162 = vminps_avx(auVar340,auVar314);
          auVar124 = vmaxps_avx(auVar314,auVar340);
          auVar257 = vinsertps_avx(auVar303,auVar260,0x4c);
          auVar171 = vmovshdup_avx(auVar77);
          auVar123 = vinsertps_avx(auVar291,auVar238,0x4c);
          auVar292._0_4_ = auVar171._0_4_ * auVar257._0_4_;
          auVar292._4_4_ = auVar171._4_4_ * auVar257._4_4_;
          auVar292._8_4_ = auVar171._8_4_ * auVar257._8_4_;
          auVar292._12_4_ = auVar171._12_4_ * auVar257._12_4_;
          auVar304._0_4_ = auVar171._0_4_ * auVar123._0_4_;
          auVar304._4_4_ = auVar171._4_4_ * auVar123._4_4_;
          auVar304._8_4_ = auVar171._8_4_ * auVar123._8_4_;
          auVar304._12_4_ = auVar171._12_4_ * auVar123._12_4_;
          auVar171 = vminps_avx(auVar292,auVar304);
          auVar113._0_4_ = auVar171._0_4_ + auVar162._0_4_;
          auVar113._4_4_ = auVar171._4_4_ + auVar162._4_4_;
          auVar113._8_4_ = auVar171._8_4_ + auVar162._8_4_;
          auVar113._12_4_ = auVar171._12_4_ + auVar162._12_4_;
          auVar162 = vmaxps_avx(auVar304,auVar292);
          auVar293._0_4_ = auVar124._0_4_ + auVar162._0_4_;
          auVar293._4_4_ = auVar124._4_4_ + auVar162._4_4_;
          auVar293._8_4_ = auVar124._8_4_ + auVar162._8_4_;
          auVar293._12_4_ = auVar124._12_4_ + auVar162._12_4_;
          auVar305._8_8_ = 0x3f80000000000000;
          auVar305._0_8_ = 0x3f80000000000000;
          auVar124 = vsubps_avx(auVar305,auVar293);
          auVar162 = vsubps_avx(auVar305,auVar113);
          auVar171 = vsubps_avx(auVar99,auVar94);
          auVar330._0_4_ = fVar139 * auVar17._0_4_;
          auVar330._4_4_ = fVar139 * auVar17._4_4_;
          auVar330._8_4_ = fVar139 * auVar17._8_4_;
          auVar330._12_4_ = fVar139 * auVar17._12_4_;
          auVar315._0_4_ = fVar139 * auVar78._0_4_;
          auVar315._4_4_ = fVar139 * auVar78._4_4_;
          auVar315._8_4_ = fVar139 * auVar78._8_4_;
          auVar315._12_4_ = fVar139 * auVar78._12_4_;
          auVar78 = vminps_avx(auVar330,auVar315);
          auVar17 = vmaxps_avx(auVar315,auVar330);
          auVar261._0_4_ = fVar197 * auVar257._0_4_;
          auVar261._4_4_ = fVar197 * auVar257._4_4_;
          auVar261._8_4_ = fVar197 * auVar257._8_4_;
          auVar261._12_4_ = fVar197 * auVar257._12_4_;
          auVar239._0_4_ = fVar197 * auVar123._0_4_;
          auVar239._4_4_ = fVar197 * auVar123._4_4_;
          auVar239._8_4_ = fVar197 * auVar123._8_4_;
          auVar239._12_4_ = fVar197 * auVar123._12_4_;
          auVar257 = vminps_avx(auVar261,auVar239);
          auVar331._0_4_ = auVar78._0_4_ + auVar257._0_4_;
          auVar331._4_4_ = auVar78._4_4_ + auVar257._4_4_;
          auVar331._8_4_ = auVar78._8_4_ + auVar257._8_4_;
          auVar331._12_4_ = auVar78._12_4_ + auVar257._12_4_;
          auVar257 = vsubps_avx(auVar122,auVar94);
          auVar78 = vmaxps_avx(auVar239,auVar261);
          fVar138 = auVar171._0_4_;
          auVar262._0_4_ = fVar138 * auVar124._0_4_;
          fVar137 = auVar171._4_4_;
          auVar262._4_4_ = fVar137 * auVar124._4_4_;
          fVar159 = auVar171._8_4_;
          auVar262._8_4_ = fVar159 * auVar124._8_4_;
          fVar160 = auVar171._12_4_;
          auVar262._12_4_ = fVar160 * auVar124._12_4_;
          auVar240._0_4_ = auVar17._0_4_ + auVar78._0_4_;
          auVar240._4_4_ = auVar17._4_4_ + auVar78._4_4_;
          auVar240._8_4_ = auVar17._8_4_ + auVar78._8_4_;
          auVar240._12_4_ = auVar17._12_4_ + auVar78._12_4_;
          auVar316._8_8_ = 0x3f800000;
          auVar316._0_8_ = 0x3f800000;
          auVar17 = vsubps_avx(auVar316,auVar240);
          auVar78 = vsubps_avx(auVar316,auVar331);
          auVar332._0_4_ = fVar138 * auVar162._0_4_;
          auVar332._4_4_ = fVar137 * auVar162._4_4_;
          auVar332._8_4_ = fVar159 * auVar162._8_4_;
          auVar332._12_4_ = fVar160 * auVar162._12_4_;
          fVar268 = auVar257._0_4_;
          auVar294._0_4_ = fVar268 * auVar124._0_4_;
          fVar270 = auVar257._4_4_;
          auVar294._4_4_ = fVar270 * auVar124._4_4_;
          fVar272 = auVar257._8_4_;
          auVar294._8_4_ = fVar272 * auVar124._8_4_;
          fVar269 = auVar257._12_4_;
          auVar294._12_4_ = fVar269 * auVar124._12_4_;
          auVar114._0_4_ = fVar268 * auVar162._0_4_;
          auVar114._4_4_ = fVar270 * auVar162._4_4_;
          auVar114._8_4_ = fVar272 * auVar162._8_4_;
          auVar114._12_4_ = fVar269 * auVar162._12_4_;
          auVar350._0_4_ = fVar138 * auVar17._0_4_;
          auVar350._4_4_ = fVar137 * auVar17._4_4_;
          auVar350._8_4_ = fVar159 * auVar17._8_4_;
          auVar350._12_4_ = fVar160 * auVar17._12_4_;
          auVar306._0_4_ = fVar138 * auVar78._0_4_;
          auVar306._4_4_ = fVar137 * auVar78._4_4_;
          auVar306._8_4_ = fVar159 * auVar78._8_4_;
          auVar306._12_4_ = fVar160 * auVar78._12_4_;
          auVar241._0_4_ = fVar268 * auVar17._0_4_;
          auVar241._4_4_ = fVar270 * auVar17._4_4_;
          auVar241._8_4_ = fVar272 * auVar17._8_4_;
          auVar241._12_4_ = fVar269 * auVar17._12_4_;
          auVar317._0_4_ = fVar268 * auVar78._0_4_;
          auVar317._4_4_ = fVar270 * auVar78._4_4_;
          auVar317._8_4_ = fVar272 * auVar78._8_4_;
          auVar317._12_4_ = fVar269 * auVar78._12_4_;
          auVar17 = vminps_avx(auVar350,auVar306);
          auVar78 = vminps_avx(auVar241,auVar317);
          auVar17 = vminps_avx(auVar17,auVar78);
          auVar78 = vmaxps_avx(auVar306,auVar350);
          auVar257 = vminps_avx(auVar262,auVar332);
          auVar123 = vminps_avx(auVar294,auVar114);
          auVar257 = vminps_avx(auVar257,auVar123);
          auVar17 = vhaddps_avx(auVar17,auVar257);
          auVar257 = vmaxps_avx(auVar317,auVar241);
          auVar78 = vmaxps_avx(auVar257,auVar78);
          auVar257 = vmaxps_avx(auVar332,auVar262);
          auVar123 = vmaxps_avx(auVar114,auVar294);
          auVar257 = vmaxps_avx(auVar123,auVar257);
          auVar78 = vhaddps_avx(auVar78,auVar257);
          auVar257 = vshufps_avx(auVar94,auVar94,0x54);
          auVar257 = vsubps_avx(auVar257,_local_740);
          auVar17 = vshufps_avx(auVar17,auVar17,0xe8);
          auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
          auVar263._0_4_ = auVar257._0_4_ + auVar17._0_4_;
          auVar263._4_4_ = auVar257._4_4_ + auVar17._4_4_;
          auVar263._8_4_ = auVar257._8_4_ + auVar17._8_4_;
          auVar263._12_4_ = auVar257._12_4_ + auVar17._12_4_;
          auVar242._0_4_ = auVar257._0_4_ + auVar78._0_4_;
          auVar242._4_4_ = auVar257._4_4_ + auVar78._4_4_;
          auVar242._8_4_ = auVar257._8_4_ + auVar78._8_4_;
          auVar242._12_4_ = auVar257._12_4_ + auVar78._12_4_;
          auVar17 = vmaxps_avx(auVar99,auVar263);
          auVar78 = vminps_avx(auVar242,auVar122);
          auVar17 = vcmpps_avx(auVar78,auVar17,1);
          auVar17 = vshufps_avx(auVar17,auVar17,0x50);
          local_780 = vinsertps_avx(auVar191,ZEXT416((uint)auVar199._0_4_),0x10);
          if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar17[0xf] < '\0') goto LAB_017ee92b;
          bVar71 = 0;
          if ((auVar219._0_4_ < auVar263._0_4_) && (bVar71 = 0, auVar242._0_4_ < auVar122._0_4_)) {
            auVar78 = vmovshdup_avx(auVar263);
            auVar17 = vcmpps_avx(auVar242,auVar122,1);
            bVar71 = auVar17[4] & auVar191._0_4_ < auVar78._0_4_;
          }
          if (((3 < (uint)uVar68 || fVar180 < 0.001) | bVar71) == 1) {
            lVar70 = 200;
            do {
              fVar159 = auVar257._0_4_;
              fVar137 = 1.0 - fVar159;
              fVar180 = fVar137 * fVar137 * fVar137;
              fVar138 = fVar159 * 3.0 * fVar137 * fVar137;
              fVar137 = fVar137 * fVar159 * fVar159 * 3.0;
              auVar193._4_4_ = fVar180;
              auVar193._0_4_ = fVar180;
              auVar193._8_4_ = fVar180;
              auVar193._12_4_ = fVar180;
              auVar133._4_4_ = fVar138;
              auVar133._0_4_ = fVar138;
              auVar133._8_4_ = fVar138;
              auVar133._12_4_ = fVar138;
              auVar115._4_4_ = fVar137;
              auVar115._0_4_ = fVar137;
              auVar115._8_4_ = fVar137;
              auVar115._12_4_ = fVar137;
              fVar159 = fVar159 * fVar159 * fVar159;
              auVar214._0_4_ = (float)local_4e0._0_4_ * fVar159;
              auVar214._4_4_ = (float)local_4e0._4_4_ * fVar159;
              auVar214._8_4_ = fStack_4d8 * fVar159;
              auVar214._12_4_ = fStack_4d4 * fVar159;
              auVar17 = vfmadd231ps_fma(auVar214,auVar186,auVar115);
              auVar17 = vfmadd231ps_fma(auVar17,auVar19,auVar133);
              auVar17 = vfmadd231ps_fma(auVar17,auVar18,auVar193);
              auVar116._8_8_ = auVar17._0_8_;
              auVar116._0_8_ = auVar17._0_8_;
              auVar17 = vshufpd_avx(auVar17,auVar17,3);
              auVar78 = vshufps_avx(auVar257,auVar257,0x55);
              auVar17 = vsubps_avx(auVar17,auVar116);
              auVar78 = vfmadd213ps_fma(auVar17,auVar78,auVar116);
              fVar180 = auVar78._0_4_;
              auVar17 = vshufps_avx(auVar78,auVar78,0x55);
              auVar117._0_4_ = fVar139 * fVar180 + fVar197 * auVar17._0_4_;
              auVar117._4_4_ = auVar80._4_4_ * fVar180 + auVar77._4_4_ * auVar17._4_4_;
              auVar117._8_4_ = auVar80._8_4_ * fVar180 + auVar77._8_4_ * auVar17._8_4_;
              auVar117._12_4_ = auVar80._12_4_ * fVar180 + auVar77._12_4_ * auVar17._12_4_;
              auVar257 = vsubps_avx(auVar257,auVar117);
              auVar17 = vandps_avx(auVar345,auVar78);
              auVar78 = vshufps_avx(auVar17,auVar17,0xf5);
              auVar17 = vmaxss_avx(auVar78,auVar17);
              if (auVar17._0_4_ < (float)local_3d0._0_4_) {
                local_120 = auVar257._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar17 = vmovshdup_avx(auVar257);
                  fVar180 = auVar17._0_4_;
                  if ((0.0 <= fVar180) && (fVar180 <= 1.0)) {
                    auVar80 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar162 = vinsertps_avx(auVar80,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar80 = vdpps_avx(auVar162,local_4f0,0x7f);
                    auVar77 = vdpps_avx(auVar162,local_500,0x7f);
                    auVar78 = vdpps_avx(auVar162,local_3e0,0x7f);
                    auVar99 = vdpps_avx(auVar162,local_3f0,0x7f);
                    auVar122 = vdpps_avx(auVar162,local_400,0x7f);
                    auVar123 = vdpps_avx(auVar162,local_410,0x7f);
                    auVar124 = vdpps_avx(auVar162,local_420,0x7f);
                    auVar162 = vdpps_avx(auVar162,local_430,0x7f);
                    fVar139 = 1.0 - fVar180;
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * auVar122._0_4_)),
                                              ZEXT416((uint)fVar139),auVar80);
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar123._0_4_ * fVar180)),
                                              ZEXT416((uint)fVar139),auVar77);
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar124._0_4_ * fVar180)),
                                              ZEXT416((uint)fVar139),auVar78);
                    auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * auVar162._0_4_)),
                                              ZEXT416((uint)fVar139),auVar99);
                    fVar137 = 1.0 - local_120;
                    fVar139 = fVar137 * local_120 * local_120 * 3.0;
                    fVar160 = local_120 * local_120 * local_120;
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * auVar99._0_4_)),
                                              ZEXT416((uint)fVar139),auVar78);
                    fVar197 = local_120 * 3.0 * fVar137 * fVar137;
                    auVar77 = vfmadd231ss_fma(auVar78,ZEXT416((uint)fVar197),auVar77);
                    fVar138 = fVar137 * fVar137 * fVar137;
                    auVar80 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar138),auVar80);
                    auVar96 = ZEXT1632(auVar80);
                    fVar159 = auVar80._0_4_;
                    if (((fVar75 <= fVar159) &&
                        (fVar268 = *(float *)(ray + k * 4 + 0x100), fVar159 <= fVar268)) &&
                       (pGVar8 = (context->scene->geometries).items[uVar67].ptr,
                       (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar77 = vshufps_avx(auVar257,auVar257,0x55);
                      auVar282._8_4_ = 0x3f800000;
                      auVar282._0_8_ = &DAT_3f8000003f800000;
                      auVar282._12_4_ = 0x3f800000;
                      auVar78 = vsubps_avx(auVar282,auVar77);
                      fVar270 = auVar77._0_4_;
                      auVar295._0_4_ = fVar270 * (float)local_530._0_4_;
                      fVar272 = auVar77._4_4_;
                      auVar295._4_4_ = fVar272 * (float)local_530._4_4_;
                      fVar269 = auVar77._8_4_;
                      auVar295._8_4_ = fVar269 * fStack_528;
                      fVar271 = auVar77._12_4_;
                      auVar295._12_4_ = fVar271 * fStack_524;
                      local_5c0 = auVar107._0_4_;
                      fStack_5bc = auVar107._4_4_;
                      fStack_5b8 = auVar107._8_4_;
                      fStack_5b4 = auVar107._12_4_;
                      auVar307._0_4_ = fVar270 * local_5c0;
                      auVar307._4_4_ = fVar272 * fStack_5bc;
                      auVar307._8_4_ = fVar269 * fStack_5b8;
                      auVar307._12_4_ = fVar271 * fStack_5b4;
                      local_5d0 = auVar22._0_4_;
                      fStack_5cc = auVar22._4_4_;
                      fStack_5c8 = auVar22._8_4_;
                      fStack_5c4 = auVar22._12_4_;
                      auVar318._0_4_ = fVar270 * local_5d0;
                      auVar318._4_4_ = fVar272 * fStack_5cc;
                      auVar318._8_4_ = fVar269 * fStack_5c8;
                      auVar318._12_4_ = fVar271 * fStack_5c4;
                      local_5e0 = auVar125._0_4_;
                      fStack_5dc = auVar125._4_4_;
                      fStack_5d8 = auVar125._8_4_;
                      fStack_5d4 = auVar125._12_4_;
                      auVar264._0_4_ = fVar270 * local_5e0;
                      auVar264._4_4_ = fVar272 * fStack_5dc;
                      auVar264._8_4_ = fVar269 * fStack_5d8;
                      auVar264._12_4_ = fVar271 * fStack_5d4;
                      auVar77 = vfmadd231ps_fma(auVar295,auVar78,local_510);
                      auVar99 = vfmadd231ps_fma(auVar307,auVar78,auVar20);
                      auVar122 = vfmadd231ps_fma(auVar318,auVar78,local_520);
                      auVar257 = vfmadd231ps_fma(auVar264,auVar78,auVar21);
                      auVar77 = vsubps_avx(auVar99,auVar77);
                      auVar78 = vsubps_avx(auVar122,auVar99);
                      auVar99 = vsubps_avx(auVar257,auVar122);
                      auVar319._0_4_ = local_120 * auVar78._0_4_;
                      auVar319._4_4_ = local_120 * auVar78._4_4_;
                      auVar319._8_4_ = local_120 * auVar78._8_4_;
                      auVar319._12_4_ = local_120 * auVar78._12_4_;
                      auVar243._4_4_ = fVar137;
                      auVar243._0_4_ = fVar137;
                      auVar243._8_4_ = fVar137;
                      auVar243._12_4_ = fVar137;
                      auVar77 = vfmadd231ps_fma(auVar319,auVar243,auVar77);
                      auVar265._0_4_ = local_120 * auVar99._0_4_;
                      auVar265._4_4_ = local_120 * auVar99._4_4_;
                      auVar265._8_4_ = local_120 * auVar99._8_4_;
                      auVar265._12_4_ = local_120 * auVar99._12_4_;
                      auVar78 = vfmadd231ps_fma(auVar265,auVar243,auVar78);
                      auVar266._0_4_ = local_120 * auVar78._0_4_;
                      auVar266._4_4_ = local_120 * auVar78._4_4_;
                      auVar266._8_4_ = local_120 * auVar78._8_4_;
                      auVar266._12_4_ = local_120 * auVar78._12_4_;
                      auVar78 = vfmadd231ps_fma(auVar266,auVar243,auVar77);
                      auVar215._0_4_ = fVar160 * (float)local_480._0_4_;
                      auVar215._4_4_ = fVar160 * (float)local_480._4_4_;
                      auVar215._8_4_ = fVar160 * fStack_478;
                      auVar215._12_4_ = fVar160 * fStack_474;
                      auVar154._4_4_ = fVar139;
                      auVar154._0_4_ = fVar139;
                      auVar154._8_4_ = fVar139;
                      auVar154._12_4_ = fVar139;
                      auVar77 = vfmadd132ps_fma(auVar154,auVar215,local_470);
                      auVar194._4_4_ = fVar197;
                      auVar194._0_4_ = fVar197;
                      auVar194._8_4_ = fVar197;
                      auVar194._12_4_ = fVar197;
                      auVar77 = vfmadd132ps_fma(auVar194,auVar77,local_460);
                      auVar216._0_4_ = auVar78._0_4_ * 3.0;
                      auVar216._4_4_ = auVar78._4_4_ * 3.0;
                      auVar216._8_4_ = auVar78._8_4_ * 3.0;
                      auVar216._12_4_ = auVar78._12_4_ * 3.0;
                      auVar177._4_4_ = fVar138;
                      auVar177._0_4_ = fVar138;
                      auVar177._8_4_ = fVar138;
                      auVar177._12_4_ = fVar138;
                      auVar78 = vfmadd132ps_fma(auVar177,auVar77,local_450);
                      auVar77 = vshufps_avx(auVar216,auVar216,0xc9);
                      auVar155._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                      auVar155._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                      auVar155._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                      auVar155._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                      auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                      auVar77 = vfmsub231ps_fma(auVar155,auVar216,auVar77);
                      local_140 = auVar77._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar159;
                        uVar76 = vextractps_avx(auVar77,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar76;
                        uVar76 = vextractps_avx(auVar77,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar76;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar180;
                        *(uint *)(ray + k * 4 + 0x220) = uVar7;
                        *(uint *)(ray + k * 4 + 0x240) = uVar67;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100._0_8_ = auVar17._0_8_;
                        local_100._8_8_ = local_100._0_8_;
                        local_100._16_8_ = local_100._0_8_;
                        local_100._24_8_ = local_100._0_8_;
                        auVar17 = vmovshdup_avx(auVar77);
                        local_180 = auVar17._0_8_;
                        auVar17 = vshufps_avx(auVar77,auVar77,0xaa);
                        local_160 = auVar17._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = CONCAT44(uStack_33c,local_340);
                        uStack_d8 = CONCAT44(uStack_334,uStack_338);
                        uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_c8 = CONCAT44(uStack_324,uStack_328);
                        local_c0 = CONCAT44(uStack_31c,local_320);
                        uStack_b8 = CONCAT44(uStack_314,uStack_318);
                        uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                        uStack_a8 = CONCAT44(uStack_304,uStack_308);
                        auVar24 = vpcmpeqd_avx2(local_100,local_100);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar159;
                        local_4c0 = local_360._0_8_;
                        uStack_4b8 = local_360._8_8_;
                        uStack_4b0 = local_360._16_8_;
                        uStack_4a8 = local_360._24_8_;
                        local_560.valid = (int *)&local_4c0;
                        local_560.geometryUserPtr = pGVar8->userPtr;
                        local_560.context = context->user;
                        local_560.hit = (RTCHitN *)&local_180;
                        local_560.N = 8;
                        local_560.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar96 = ZEXT1632(auVar80);
                          (*pGVar8->intersectionFilterN)(&local_560);
                          auVar121._8_56_ = extraout_var;
                          auVar121._0_8_ = extraout_XMM1_Qa;
                          auVar24 = vpcmpeqd_avx2(auVar121._0_32_,auVar121._0_32_);
                        }
                        auVar56._8_8_ = uStack_4b8;
                        auVar56._0_8_ = local_4c0;
                        auVar56._16_8_ = uStack_4b0;
                        auVar56._24_8_ = uStack_4a8;
                        auVar98 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar56);
                        auVar97 = auVar24 & ~auVar98;
                        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar97 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar97 >> 0x7f,0) == '\0') &&
                              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar97 >> 0xbf,0) == '\0') &&
                            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar97[0x1f]) {
                          auVar98 = auVar98 ^ auVar24;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar96 = ZEXT1632(auVar96._0_16_);
                            (*p_Var14)(&local_560);
                          }
                          auVar57._8_8_ = uStack_4b8;
                          auVar57._0_8_ = local_4c0;
                          auVar57._16_8_ = uStack_4b0;
                          auVar57._24_8_ = uStack_4a8;
                          auVar24 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar57
                                                 );
                          auVar97 = vpcmpeqd_avx2(auVar96,auVar96);
                          auVar98 = auVar24 ^ auVar97;
                          auVar96 = auVar97 & ~auVar24;
                          if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar96 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar96 >> 0x7f,0) != '\0') ||
                                (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar96 >> 0xbf,0) != '\0') ||
                              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar96[0x1f] < '\0') {
                            auVar120._0_4_ = auVar24._0_4_ ^ auVar97._0_4_;
                            auVar120._4_4_ = auVar24._4_4_ ^ auVar97._4_4_;
                            auVar120._8_4_ = auVar24._8_4_ ^ auVar97._8_4_;
                            auVar120._12_4_ = auVar24._12_4_ ^ auVar97._12_4_;
                            auVar120._16_4_ = auVar24._16_4_ ^ auVar97._16_4_;
                            auVar120._20_4_ = auVar24._20_4_ ^ auVar97._20_4_;
                            auVar120._24_4_ = auVar24._24_4_ ^ auVar97._24_4_;
                            auVar120._28_4_ = auVar24._28_4_ ^ auVar97._28_4_;
                            auVar96 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])local_560.hit);
                            *(undefined1 (*) [32])(local_560.ray + 0x180) = auVar96;
                            auVar96 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                               (local_560.hit + 0x20));
                            *(undefined1 (*) [32])(local_560.ray + 0x1a0) = auVar96;
                            auVar96 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                               (local_560.hit + 0x40));
                            *(undefined1 (*) [32])(local_560.ray + 0x1c0) = auVar96;
                            auVar96 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                               (local_560.hit + 0x60));
                            *(undefined1 (*) [32])(local_560.ray + 0x1e0) = auVar96;
                            auVar96 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                               (local_560.hit + 0x80));
                            *(undefined1 (*) [32])(local_560.ray + 0x200) = auVar96;
                            auVar96 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                                (local_560.hit + 0xa0));
                            *(undefined1 (*) [32])(local_560.ray + 0x220) = auVar96;
                            auVar96 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                                (local_560.hit + 0xc0));
                            *(undefined1 (*) [32])(local_560.ray + 0x240) = auVar96;
                            auVar96 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                                (local_560.hit + 0xe0));
                            *(undefined1 (*) [32])(local_560.ray + 0x260) = auVar96;
                            auVar96 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                                (local_560.hit + 0x100));
                            *(undefined1 (*) [32])(local_560.ray + 0x280) = auVar96;
                          }
                        }
                        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar98 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar98 >> 0x7f,0) == '\0') &&
                              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar98 >> 0xbf,0) == '\0') &&
                            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar98[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar268;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
          }
          else {
            bVar51 = false;
          }
        }
      }
    } while (bVar51);
    local_440 = vinsertps_avx(auVar16,ZEXT416((uint)fVar196),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }